

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  uint uVar90;
  long lVar91;
  uint uVar92;
  undefined4 uVar93;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uVar94;
  bool bVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar123;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar144 [32];
  float fVar156;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar133 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar143 [16];
  undefined1 auVar153 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar165 [32];
  float fVar173;
  float fVar177;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar208 [28];
  undefined1 auVar209 [32];
  undefined1 auVar207 [16];
  undefined1 auVar210 [32];
  undefined1 auVar217 [16];
  undefined1 auVar223 [32];
  float fVar231;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar228 [32];
  float fVar230;
  undefined1 auVar229 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  undefined8 uVar239;
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar251;
  float fVar253;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar266;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 in_ZMM10 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar273 [32];
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar280 [16];
  undefined1 auVar279 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar293 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  float local_ab8;
  float local_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 *local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8b0 [16];
  Primitive *local_898;
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [8];
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar267 [16];
  undefined1 auVar294 [32];
  
  PVar3 = prim[1];
  uVar94 = (ulong)(byte)PVar3;
  lVar91 = uVar94 * 0x19;
  fVar96 = *(float *)(prim + lVar91 + 0x12);
  auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar194 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar186 = vsubps_avx(auVar186,*(undefined1 (*) [16])(prim + lVar91 + 6));
  auVar98._0_4_ = fVar96 * auVar186._0_4_;
  auVar98._4_4_ = fVar96 * auVar186._4_4_;
  auVar98._8_4_ = fVar96 * auVar186._8_4_;
  auVar98._12_4_ = fVar96 * auVar186._12_4_;
  auVar240._0_4_ = fVar96 * auVar194._0_4_;
  auVar240._4_4_ = fVar96 * auVar194._4_4_;
  auVar240._8_4_ = fVar96 * auVar194._8_4_;
  auVar240._12_4_ = fVar96 * auVar194._12_4_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar94 * 4 + 6);
  auVar106 = vpmovsxbd_avx2(auVar186);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar94 * 5 + 6);
  auVar169 = vpmovsxbd_avx2(auVar194);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar94 * 6 + 6);
  auVar289 = vpmovsxbd_avx2(auVar219);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar7 = vpmovsxbd_avx2(auVar161);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar8 = vpmovsxbd_avx2(auVar103);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar94 + 6);
  auVar167 = vpmovsxbd_avx2(auVar281);
  auVar167 = vcvtdq2ps_avx(auVar167);
  uVar88 = (ulong)(uint)((int)(uVar94 * 9) * 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar199 = vpmovsxbd_avx2(auVar2);
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar88 + uVar94 + 6);
  auVar9 = vpmovsxbd_avx2(auVar130);
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar88 = (ulong)(uint)((int)(uVar94 * 5) << 2);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar10 = vpmovsxbd_avx2(auVar140);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar284._4_4_ = auVar240._0_4_;
  auVar284._0_4_ = auVar240._0_4_;
  auVar284._8_4_ = auVar240._0_4_;
  auVar284._12_4_ = auVar240._0_4_;
  auVar284._16_4_ = auVar240._0_4_;
  auVar284._20_4_ = auVar240._0_4_;
  auVar284._24_4_ = auVar240._0_4_;
  auVar284._28_4_ = auVar240._0_4_;
  auVar186 = vmovshdup_avx(auVar240);
  uVar239 = auVar186._0_8_;
  auVar293._8_8_ = uVar239;
  auVar293._0_8_ = uVar239;
  auVar293._16_8_ = uVar239;
  auVar293._24_8_ = uVar239;
  auVar186 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar96 = auVar186._0_4_;
  auVar202._0_4_ = fVar96 * auVar289._0_4_;
  fVar123 = auVar186._4_4_;
  auVar202._4_4_ = fVar123 * auVar289._4_4_;
  auVar202._8_4_ = fVar96 * auVar289._8_4_;
  auVar202._12_4_ = fVar123 * auVar289._12_4_;
  auVar202._16_4_ = fVar96 * auVar289._16_4_;
  auVar202._20_4_ = fVar123 * auVar289._20_4_;
  auVar202._28_36_ = in_ZMM12._28_36_;
  auVar202._24_4_ = fVar96 * auVar289._24_4_;
  auVar296._0_4_ = auVar167._0_4_ * fVar96;
  auVar296._4_4_ = auVar167._4_4_ * fVar123;
  auVar296._8_4_ = auVar167._8_4_ * fVar96;
  auVar296._12_4_ = auVar167._12_4_ * fVar123;
  auVar296._16_4_ = auVar167._16_4_ * fVar96;
  auVar296._20_4_ = auVar167._20_4_ * fVar123;
  auVar296._28_36_ = in_ZMM10._28_36_;
  auVar296._24_4_ = auVar167._24_4_ * fVar96;
  auVar264._0_4_ = auVar10._0_4_ * fVar96;
  auVar264._4_4_ = auVar10._4_4_ * fVar123;
  auVar264._8_4_ = auVar10._8_4_ * fVar96;
  auVar264._12_4_ = auVar10._12_4_ * fVar123;
  auVar264._16_4_ = auVar10._16_4_ * fVar96;
  auVar264._20_4_ = auVar10._20_4_ * fVar123;
  auVar264._24_4_ = auVar10._24_4_ * fVar96;
  auVar264._28_4_ = 0;
  auVar186 = vfmadd231ps_fma(auVar202._0_32_,auVar293,auVar169);
  auVar194 = vfmadd231ps_fma(auVar296._0_32_,auVar293,auVar8);
  auVar219 = vfmadd231ps_fma(auVar264,auVar9,auVar293);
  auVar161 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar284,auVar106);
  auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar284,auVar7);
  auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar199,auVar284);
  auVar285._4_4_ = auVar98._0_4_;
  auVar285._0_4_ = auVar98._0_4_;
  auVar285._8_4_ = auVar98._0_4_;
  auVar285._12_4_ = auVar98._0_4_;
  auVar285._16_4_ = auVar98._0_4_;
  auVar285._20_4_ = auVar98._0_4_;
  auVar285._24_4_ = auVar98._0_4_;
  auVar285._28_4_ = auVar98._0_4_;
  auVar186 = vmovshdup_avx(auVar98);
  uVar239 = auVar186._0_8_;
  auVar294._8_8_ = uVar239;
  auVar294._0_8_ = uVar239;
  auVar294._16_8_ = uVar239;
  auVar294._24_8_ = uVar239;
  auVar296 = ZEXT3264(auVar294);
  auVar186 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar96 = auVar186._0_4_;
  auVar242._0_4_ = fVar96 * auVar289._0_4_;
  fVar123 = auVar186._4_4_;
  auVar242._4_4_ = fVar123 * auVar289._4_4_;
  auVar242._8_4_ = fVar96 * auVar289._8_4_;
  auVar242._12_4_ = fVar123 * auVar289._12_4_;
  auVar242._16_4_ = fVar96 * auVar289._16_4_;
  auVar242._20_4_ = fVar123 * auVar289._20_4_;
  auVar242._24_4_ = fVar96 * auVar289._24_4_;
  auVar242._28_4_ = 0;
  auVar11._4_4_ = auVar167._4_4_ * fVar123;
  auVar11._0_4_ = auVar167._0_4_ * fVar96;
  auVar11._8_4_ = auVar167._8_4_ * fVar96;
  auVar11._12_4_ = auVar167._12_4_ * fVar123;
  auVar11._16_4_ = auVar167._16_4_ * fVar96;
  auVar11._20_4_ = auVar167._20_4_ * fVar123;
  auVar11._24_4_ = auVar167._24_4_ * fVar96;
  auVar11._28_4_ = auVar289._28_4_;
  auVar289._4_4_ = auVar10._4_4_ * fVar123;
  auVar289._0_4_ = auVar10._0_4_ * fVar96;
  auVar289._8_4_ = auVar10._8_4_ * fVar96;
  auVar289._12_4_ = auVar10._12_4_ * fVar123;
  auVar289._16_4_ = auVar10._16_4_ * fVar96;
  auVar289._20_4_ = auVar10._20_4_ * fVar123;
  auVar289._24_4_ = auVar10._24_4_ * fVar96;
  auVar289._28_4_ = fVar123;
  auVar186 = vfmadd231ps_fma(auVar242,auVar294,auVar169);
  auVar103 = vfmadd231ps_fma(auVar11,auVar294,auVar8);
  auVar281 = vfmadd231ps_fma(auVar289,auVar294,auVar9);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar285,auVar106);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar285,auVar7);
  local_860._8_4_ = 0x7fffffff;
  local_860._0_8_ = 0x7fffffff7fffffff;
  local_860._12_4_ = 0x7fffffff;
  local_860._16_4_ = 0x7fffffff;
  local_860._20_4_ = 0x7fffffff;
  local_860._24_4_ = 0x7fffffff;
  local_860._28_4_ = 0x7fffffff;
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  auVar259._16_4_ = 0x219392ef;
  auVar259._20_4_ = 0x219392ef;
  auVar259._24_4_ = 0x219392ef;
  auVar259._28_4_ = 0x219392ef;
  auVar106 = vandps_avx(ZEXT1632(auVar161),local_860);
  auVar106 = vcmpps_avx(auVar106,auVar259,1);
  auVar169 = vblendvps_avx(ZEXT1632(auVar161),auVar259,auVar106);
  auVar106 = vandps_avx(ZEXT1632(auVar194),local_860);
  auVar106 = vcmpps_avx(auVar106,auVar259,1);
  auVar289 = vblendvps_avx(ZEXT1632(auVar194),auVar259,auVar106);
  auVar106 = vandps_avx(ZEXT1632(auVar219),local_860);
  auVar106 = vcmpps_avx(auVar106,auVar259,1);
  auVar106 = vblendvps_avx(ZEXT1632(auVar219),auVar259,auVar106);
  auVar161 = vfmadd231ps_fma(ZEXT1632(auVar281),auVar285,auVar199);
  auVar7 = vrcpps_avx(auVar169);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = &DAT_3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar197._16_4_ = 0x3f800000;
  auVar197._20_4_ = 0x3f800000;
  auVar197._24_4_ = 0x3f800000;
  auVar197._28_4_ = 0x3f800000;
  auVar186 = vfnmadd213ps_fma(auVar169,auVar7,auVar197);
  auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar7,auVar7);
  auVar169 = vrcpps_avx(auVar289);
  auVar194 = vfnmadd213ps_fma(auVar289,auVar169,auVar197);
  auVar194 = vfmadd132ps_fma(ZEXT1632(auVar194),auVar169,auVar169);
  auVar169 = vrcpps_avx(auVar106);
  auVar219 = vfnmadd213ps_fma(auVar106,auVar169,auVar197);
  auVar219 = vfmadd132ps_fma(ZEXT1632(auVar219),auVar169,auVar169);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 7 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar2));
  auVar7._4_4_ = auVar186._4_4_ * auVar106._4_4_;
  auVar7._0_4_ = auVar186._0_4_ * auVar106._0_4_;
  auVar7._8_4_ = auVar186._8_4_ * auVar106._8_4_;
  auVar7._12_4_ = auVar186._12_4_ * auVar106._12_4_;
  auVar7._16_4_ = auVar106._16_4_ * 0.0;
  auVar7._20_4_ = auVar106._20_4_ * 0.0;
  auVar7._24_4_ = auVar106._24_4_ * 0.0;
  auVar7._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 9 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar2));
  auVar8._4_4_ = auVar186._4_4_ * auVar106._4_4_;
  auVar8._0_4_ = auVar186._0_4_ * auVar106._0_4_;
  auVar8._8_4_ = auVar186._8_4_ * auVar106._8_4_;
  auVar8._12_4_ = auVar186._12_4_ * auVar106._12_4_;
  auVar8._16_4_ = auVar106._16_4_ * 0.0;
  auVar8._20_4_ = auVar106._20_4_ * 0.0;
  auVar8._24_4_ = auVar106._24_4_ * 0.0;
  auVar8._28_4_ = auVar106._28_4_;
  auVar144._1_3_ = 0;
  auVar144[0] = PVar3;
  auVar169 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar3 * 0x10 + uVar94 * -2 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar103));
  auVar167._4_4_ = auVar106._4_4_ * auVar194._4_4_;
  auVar167._0_4_ = auVar106._0_4_ * auVar194._0_4_;
  auVar167._8_4_ = auVar106._8_4_ * auVar194._8_4_;
  auVar167._12_4_ = auVar106._12_4_ * auVar194._12_4_;
  auVar167._16_4_ = auVar106._16_4_ * 0.0;
  auVar167._20_4_ = auVar106._20_4_ * 0.0;
  auVar167._24_4_ = auVar106._24_4_ * 0.0;
  auVar167._28_4_ = auVar106._28_4_;
  auVar106 = vcvtdq2ps_avx(auVar169);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar103));
  auVar199._4_4_ = auVar194._4_4_ * auVar106._4_4_;
  auVar199._0_4_ = auVar194._0_4_ * auVar106._0_4_;
  auVar199._8_4_ = auVar194._8_4_ * auVar106._8_4_;
  auVar199._12_4_ = auVar194._12_4_ * auVar106._12_4_;
  auVar199._16_4_ = auVar106._16_4_ * 0.0;
  auVar199._20_4_ = auVar106._20_4_ * 0.0;
  auVar199._24_4_ = auVar106._24_4_ * 0.0;
  auVar199._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 + uVar94 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar161));
  auVar9._4_4_ = auVar106._4_4_ * auVar219._4_4_;
  auVar9._0_4_ = auVar106._0_4_ * auVar219._0_4_;
  auVar9._8_4_ = auVar106._8_4_ * auVar219._8_4_;
  auVar9._12_4_ = auVar106._12_4_ * auVar219._12_4_;
  auVar9._16_4_ = auVar106._16_4_ * 0.0;
  auVar9._20_4_ = auVar106._20_4_ * 0.0;
  auVar9._24_4_ = auVar106._24_4_ * 0.0;
  auVar9._28_4_ = auVar106._28_4_;
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar94 * 0x17 + 6));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,ZEXT1632(auVar161));
  auVar10._4_4_ = auVar219._4_4_ * auVar106._4_4_;
  auVar10._0_4_ = auVar219._0_4_ * auVar106._0_4_;
  auVar10._8_4_ = auVar219._8_4_ * auVar106._8_4_;
  auVar10._12_4_ = auVar219._12_4_ * auVar106._12_4_;
  auVar10._16_4_ = auVar106._16_4_ * 0.0;
  auVar10._20_4_ = auVar106._20_4_ * 0.0;
  auVar10._24_4_ = auVar106._24_4_ * 0.0;
  auVar10._28_4_ = auVar106._28_4_;
  auVar106 = vpminsd_avx2(auVar7,auVar8);
  auVar169 = vpminsd_avx2(auVar167,auVar199);
  auVar106 = vmaxps_avx(auVar106,auVar169);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar243._4_4_ = uVar1;
  auVar243._0_4_ = uVar1;
  auVar243._8_4_ = uVar1;
  auVar243._12_4_ = uVar1;
  auVar243._16_4_ = uVar1;
  auVar243._20_4_ = uVar1;
  auVar243._24_4_ = uVar1;
  auVar243._28_4_ = uVar1;
  auVar169 = vpminsd_avx2(auVar9,auVar10);
  auVar169 = vmaxps_avx(auVar169,auVar243);
  auVar106 = vmaxps_avx(auVar106,auVar169);
  local_3a0._4_4_ = auVar106._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar106._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar106._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar106._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar106._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar106._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar106._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar169._28_4_;
  auVar106 = vpmaxsd_avx2(auVar7,auVar8);
  auVar169 = vpmaxsd_avx2(auVar167,auVar199);
  auVar106 = vminps_avx(auVar106,auVar169);
  auVar169 = vpmaxsd_avx2(auVar9,auVar10);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar165._4_4_ = uVar1;
  auVar165._0_4_ = uVar1;
  auVar165._8_4_ = uVar1;
  auVar165._12_4_ = uVar1;
  auVar165._16_4_ = uVar1;
  auVar165._20_4_ = uVar1;
  auVar165._24_4_ = uVar1;
  auVar165._28_4_ = uVar1;
  auVar169 = vminps_avx(auVar169,auVar165);
  auVar106 = vminps_avx(auVar106,auVar169);
  auVar107._4_4_ = auVar106._4_4_ * 1.0000004;
  auVar107._0_4_ = auVar106._0_4_ * 1.0000004;
  auVar107._8_4_ = auVar106._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar106._12_4_ * 1.0000004;
  auVar107._16_4_ = auVar106._16_4_ * 1.0000004;
  auVar107._20_4_ = auVar106._20_4_ * 1.0000004;
  auVar107._24_4_ = auVar106._24_4_ * 1.0000004;
  auVar107._28_4_ = auVar106._28_4_;
  auVar144[4] = PVar3;
  auVar144._5_3_ = 0;
  auVar144[8] = PVar3;
  auVar144._9_3_ = 0;
  auVar144[0xc] = PVar3;
  auVar144._13_3_ = 0;
  auVar144[0x10] = PVar3;
  auVar144._17_3_ = 0;
  auVar144[0x14] = PVar3;
  auVar144._21_3_ = 0;
  auVar144[0x18] = PVar3;
  auVar144._25_3_ = 0;
  auVar144[0x1c] = PVar3;
  auVar144._29_3_ = 0;
  auVar169 = vpcmpgtd_avx2(auVar144,_DAT_0205a920);
  auVar106 = vcmpps_avx(local_3a0,auVar107,2);
  auVar106 = vandps_avx(auVar106,auVar169);
  uVar90 = vmovmskps_avx(auVar106);
  if (uVar90 == 0) {
    return;
  }
  uVar90 = uVar90 & 0xff;
  local_898 = prim + lVar91 + 0x16;
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  local_9a8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_890 = prim;
LAB_0181635b:
  lVar91 = 0;
  local_888 = (ulong)uVar90;
  for (uVar94 = local_888; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    lVar91 = lVar91 + 1;
  }
  local_888 = local_888 - 1 & local_888;
  uVar1 = *(undefined4 *)(local_890 + lVar91 * 4 + 6);
  uVar94 = (ulong)(uint)((int)lVar91 << 6);
  auVar186 = *(undefined1 (*) [16])(local_898 + uVar94);
  if (local_888 != 0) {
    uVar89 = local_888 - 1 & local_888;
    for (uVar88 = local_888; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    }
    if (uVar89 != 0) {
      for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar194 = *(undefined1 (*) [16])(local_898 + uVar94 + 0x10);
  auVar219 = *(undefined1 (*) [16])(local_898 + uVar94 + 0x20);
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar281 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar257._4_4_ = uVar93;
  auVar257._0_4_ = uVar93;
  auVar257._8_4_ = uVar93;
  auVar257._12_4_ = uVar93;
  fStack_7d0 = (float)uVar93;
  _local_7e0 = auVar257;
  fStack_7cc = (float)uVar93;
  fStack_7c8 = (float)uVar93;
  register0x0000141c = uVar93;
  auVar262 = ZEXT3264(_local_7e0);
  auVar161 = *(undefined1 (*) [16])(local_898 + uVar94 + 0x30);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar263._4_4_ = uVar93;
  auVar263._0_4_ = uVar93;
  auVar263._8_4_ = uVar93;
  auVar263._12_4_ = uVar93;
  fStack_7f0 = (float)uVar93;
  _local_800 = auVar263;
  fStack_7ec = (float)uVar93;
  fStack_7e8 = (float)uVar93;
  register0x0000145c = uVar93;
  auVar265 = ZEXT3264(_local_800);
  auVar103 = vunpcklps_avx(auVar257,auVar263);
  fVar96 = *(float *)(ray + k * 4 + 0x60);
  auVar267._4_4_ = fVar96;
  auVar267._0_4_ = fVar96;
  auVar267._8_4_ = fVar96;
  auVar267._12_4_ = fVar96;
  fStack_830 = fVar96;
  _local_840 = auVar267;
  fStack_82c = fVar96;
  fStack_828 = fVar96;
  register0x0000149c = fVar96;
  auVar268 = ZEXT3264(_local_840);
  local_930 = vinsertps_avx(auVar103,auVar267,0x28);
  auVar274 = ZEXT1664(local_930);
  auVar217._0_4_ = (auVar186._0_4_ + auVar194._0_4_ + auVar219._0_4_ + auVar161._0_4_) * 0.25;
  auVar217._4_4_ = (auVar186._4_4_ + auVar194._4_4_ + auVar219._4_4_ + auVar161._4_4_) * 0.25;
  auVar217._8_4_ = (auVar186._8_4_ + auVar194._8_4_ + auVar219._8_4_ + auVar161._8_4_) * 0.25;
  auVar217._12_4_ = (auVar186._12_4_ + auVar194._12_4_ + auVar219._12_4_ + auVar161._12_4_) * 0.25;
  auVar103 = vsubps_avx(auVar217,auVar281);
  auVar103 = vdpps_avx(auVar103,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  uVar90 = *(uint *)(local_890 + 2);
  auVar2 = vrcpss_avx(local_940,local_940);
  auVar130 = vfnmadd213ss_fma(auVar2,local_940,ZEXT416(0x40000000));
  auVar250 = ZEXT1664(auVar130);
  local_380 = auVar103._0_4_ * auVar2._0_4_ * auVar130._0_4_;
  auVar229 = ZEXT464((uint)local_380);
  auVar232._4_4_ = local_380;
  auVar232._0_4_ = local_380;
  auVar232._8_4_ = local_380;
  auVar232._12_4_ = local_380;
  fStack_790 = local_380;
  _local_7a0 = auVar232;
  fStack_78c = local_380;
  fStack_788 = local_380;
  fStack_784 = local_380;
  auVar103 = vfmadd231ps_fma(auVar281,local_930,auVar232);
  auVar103 = vblendps_avx(auVar103,_DAT_01feba10,8);
  local_a80 = vsubps_avx(auVar186,auVar103);
  local_a90 = vsubps_avx(auVar219,auVar103);
  local_aa0 = vsubps_avx(auVar194,auVar103);
  _local_ab0 = vsubps_avx(auVar161,auVar103);
  auVar202 = ZEXT1664(_local_ab0);
  auVar186 = vmovshdup_avx(local_a80);
  local_1a0 = auVar186._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar186 = vshufps_avx(local_a80,local_a80,0xaa);
  local_1c0 = auVar186._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar186 = vshufps_avx(local_a80,local_a80,0xff);
  local_1e0 = auVar186._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar186 = vmovshdup_avx(local_aa0);
  local_200 = auVar186._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar186 = vshufps_avx(local_aa0,local_aa0,0xaa);
  local_220 = auVar186._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar186 = vshufps_avx(local_aa0,local_aa0,0xff);
  local_240 = auVar186._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar186 = vmovshdup_avx(local_a90);
  local_440 = auVar186._0_4_;
  fStack_43c = auVar186._4_4_;
  auVar186 = vshufps_avx(local_a90,local_a90,0xaa);
  local_460 = auVar186._0_4_;
  fStack_45c = auVar186._4_4_;
  auVar186 = vshufps_avx(local_a90,local_a90,0xff);
  local_260 = auVar186._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar186 = vmovshdup_avx(_local_ab0);
  local_280 = auVar186._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar186 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  local_2a0 = auVar186._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar186 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  local_2c0 = auVar186._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar186 = vfmadd231ps_fma(ZEXT432((uint)(fVar96 * fVar96)),_local_800,_local_800);
  auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),_local_7e0,_local_7e0);
  uVar93 = auVar186._0_4_;
  local_2e0._4_4_ = uVar93;
  local_2e0._0_4_ = uVar93;
  local_2e0._8_4_ = uVar93;
  local_2e0._12_4_ = uVar93;
  local_2e0._16_4_ = uVar93;
  local_2e0._20_4_ = uVar93;
  local_2e0._24_4_ = uVar93;
  local_2e0._28_4_ = uVar93;
  fVar96 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)local_380);
  local_380 = fVar96 - local_380;
  fStack_37c = local_380;
  fStack_378 = local_380;
  fStack_374 = local_380;
  fStack_370 = local_380;
  fStack_36c = local_380;
  fStack_368 = local_380;
  fStack_364 = local_380;
  uVar94 = 1;
  uVar88 = 0;
  local_300 = local_a80._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_aa0._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_a90._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_ab0._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_4a0 = vandps_avx(local_2e0,local_860);
  auVar186 = vsqrtss_avx(local_940,local_940);
  local_ab4 = auVar186._0_4_;
  auVar186 = vsqrtss_avx(local_940,local_940);
  local_ab8 = auVar186._0_4_;
  local_8c0 = 0x3f80000000000000;
  uStack_8b8 = 0;
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = &DAT_3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar169._16_4_ = 0x3f800000;
  auVar169._20_4_ = 0x3f800000;
  auVar169._24_4_ = 0x3f800000;
  auVar169._28_4_ = 0x3f800000;
  local_6e0 = uVar1;
  uStack_6dc = uVar1;
  uStack_6d8 = uVar1;
  uStack_6d4 = uVar1;
  local_6d0 = uVar90;
  uStack_6cc = uVar90;
  uStack_6c8 = uVar90;
  uStack_6c4 = uVar90;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar72._8_8_ = uStack_8b8;
    auVar72._0_8_ = local_8c0;
    auVar186 = vmovshdup_avx(auVar72);
    local_9a0._0_4_ = (float)local_8c0;
    fVar123 = auVar186._0_4_ - local_9a0._0_4_;
    fVar159 = fVar123 * 0.04761905;
    local_9a0._4_4_ = local_9a0._0_4_;
    local_9a0._8_4_ = local_9a0._0_4_;
    local_9a0._12_4_ = local_9a0._0_4_;
    local_9a0._16_4_ = local_9a0._0_4_;
    local_9a0._20_4_ = local_9a0._0_4_;
    local_9a0._24_4_ = local_9a0._0_4_;
    local_9a0._28_4_ = local_9a0._0_4_;
    local_720._4_4_ = fVar123;
    local_720._0_4_ = fVar123;
    local_720._8_4_ = fVar123;
    local_720._12_4_ = fVar123;
    local_720._16_4_ = fVar123;
    local_720._20_4_ = fVar123;
    local_720._24_4_ = fVar123;
    local_720._28_4_ = fVar123;
    auVar186 = vfmadd231ps_fma(local_9a0,local_720,_DAT_02020f20);
    auVar106 = vsubps_avx(auVar169,ZEXT1632(auVar186));
    auVar78._4_4_ = fStack_31c;
    auVar78._0_4_ = local_320;
    auVar78._8_4_ = fStack_318;
    auVar78._12_4_ = fStack_314;
    auVar78._16_4_ = fStack_310;
    auVar78._20_4_ = fStack_30c;
    auVar78._24_4_ = fStack_308;
    auVar78._28_4_ = fStack_304;
    fVar123 = auVar186._0_4_;
    auVar275._0_4_ = local_320 * fVar123;
    fVar97 = auVar186._4_4_;
    auVar275._4_4_ = fStack_31c * fVar97;
    fVar154 = auVar186._8_4_;
    auVar275._8_4_ = fStack_318 * fVar154;
    fVar290 = auVar186._12_4_;
    auVar275._12_4_ = fStack_314 * fVar290;
    auVar275._16_4_ = fStack_310 * 0.0;
    auVar275._20_4_ = fStack_30c * 0.0;
    auVar275._28_36_ = auVar274._28_36_;
    auVar275._24_4_ = fStack_308 * 0.0;
    auVar83._8_8_ = uStack_1f8;
    auVar83._0_8_ = local_200;
    auVar83._16_8_ = uStack_1f0;
    auVar83._24_8_ = uStack_1e8;
    auVar269._0_4_ = (float)local_200 * fVar123;
    auVar269._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar97;
    auVar269._8_4_ = (float)uStack_1f8 * fVar154;
    auVar269._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar290;
    auVar269._16_4_ = (float)uStack_1f0 * 0.0;
    auVar269._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar269._28_36_ = auVar268._28_36_;
    auVar269._24_4_ = (float)uStack_1e8 * 0.0;
    auVar82._8_8_ = uStack_218;
    auVar82._0_8_ = local_220;
    auVar82._16_8_ = uStack_210;
    auVar82._24_8_ = uStack_208;
    auVar274._0_4_ = (float)local_220 * fVar123;
    auVar274._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar97;
    auVar274._8_4_ = (float)uStack_218 * fVar154;
    auVar274._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar290;
    auVar274._16_4_ = (float)uStack_210 * 0.0;
    auVar274._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar274._28_36_ = auVar265._28_36_;
    auVar274._24_4_ = (float)uStack_208 * 0.0;
    auVar81._8_8_ = uStack_238;
    auVar81._0_8_ = local_240;
    auVar81._16_8_ = uStack_230;
    auVar81._24_8_ = uStack_228;
    auVar265._0_4_ = (float)local_240 * fVar123;
    auVar265._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar97;
    auVar265._8_4_ = (float)uStack_238 * fVar154;
    auVar265._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar290;
    auVar265._16_4_ = (float)uStack_230 * 0.0;
    auVar265._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar265._28_36_ = auVar250._28_36_;
    auVar265._24_4_ = (float)uStack_228 * 0.0;
    auVar79._4_4_ = uStack_2fc;
    auVar79._0_4_ = local_300;
    auVar79._8_4_ = uStack_2f8;
    auVar79._12_4_ = uStack_2f4;
    auVar79._16_4_ = uStack_2f0;
    auVar79._20_4_ = uStack_2ec;
    auVar79._24_4_ = uStack_2e8;
    auVar79._28_4_ = uStack_2e4;
    auVar186 = vfmadd231ps_fma(auVar275._0_32_,auVar106,auVar79);
    auVar86._8_8_ = uStack_198;
    auVar86._0_8_ = local_1a0;
    auVar86._16_8_ = uStack_190;
    auVar86._24_8_ = uStack_188;
    auVar194 = vfmadd231ps_fma(auVar269._0_32_,auVar106,auVar86);
    auVar85._8_8_ = uStack_1b8;
    auVar85._0_8_ = local_1c0;
    auVar85._16_8_ = uStack_1b0;
    auVar85._24_8_ = uStack_1a8;
    auVar219 = vfmadd231ps_fma(auVar274._0_32_,auVar106,auVar85);
    auVar84._8_8_ = uStack_1d8;
    auVar84._0_8_ = local_1e0;
    auVar84._16_8_ = uStack_1d0;
    auVar84._24_8_ = uStack_1c8;
    auVar161 = vfmadd231ps_fma(auVar265._0_32_,auVar106,auVar84);
    auVar77._4_4_ = fStack_33c;
    auVar77._0_4_ = local_340;
    auVar77._8_4_ = fStack_338;
    auVar77._12_4_ = fStack_334;
    auVar77._16_4_ = fStack_330;
    auVar77._20_4_ = fStack_32c;
    auVar77._24_4_ = fStack_328;
    auVar77._28_4_ = fStack_324;
    auVar268._0_4_ = local_340 * fVar123;
    auVar268._4_4_ = fStack_33c * fVar97;
    auVar268._8_4_ = fStack_338 * fVar154;
    auVar268._12_4_ = fStack_334 * fVar290;
    auVar268._16_4_ = fStack_330 * 0.0;
    auVar268._20_4_ = fStack_32c * 0.0;
    auVar268._28_36_ = auVar262._28_36_;
    auVar268._24_4_ = fStack_328 * 0.0;
    auVar250._0_4_ = fVar123 * local_440;
    auVar250._4_4_ = fVar97 * fStack_43c;
    auVar250._8_4_ = fVar154 * fStack_438;
    auVar250._12_4_ = fVar290 * fStack_434;
    auVar250._16_4_ = fStack_430 * 0.0;
    auVar250._20_4_ = fStack_42c * 0.0;
    auVar250._28_36_ = auVar229._28_36_;
    auVar250._24_4_ = fStack_428 * 0.0;
    auVar229._0_4_ = fVar123 * local_460;
    auVar229._4_4_ = fVar97 * fStack_45c;
    auVar229._8_4_ = fVar154 * fStack_458;
    auVar229._12_4_ = fVar290 * fStack_454;
    auVar229._16_4_ = fStack_450 * 0.0;
    auVar229._20_4_ = fStack_44c * 0.0;
    auVar229._28_36_ = auVar202._28_36_;
    auVar229._24_4_ = fStack_448 * 0.0;
    auVar80._8_8_ = uStack_258;
    auVar80._0_8_ = local_260;
    auVar80._16_8_ = uStack_250;
    auVar80._24_8_ = uStack_248;
    auVar262._0_4_ = (float)local_260 * fVar123;
    auVar262._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar97;
    auVar262._8_4_ = (float)uStack_258 * fVar154;
    auVar262._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar290;
    auVar262._16_4_ = (float)uStack_250 * 0.0;
    auVar262._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar262._28_36_ = auVar296._28_36_;
    auVar262._24_4_ = (float)uStack_248 * 0.0;
    auVar103 = vfmadd231ps_fma(auVar268._0_32_,auVar106,auVar78);
    auVar281 = vfmadd231ps_fma(auVar250._0_32_,auVar106,auVar83);
    auVar2 = vfmadd231ps_fma(auVar229._0_32_,auVar106,auVar82);
    auVar130 = vfmadd231ps_fma(auVar262._0_32_,auVar106,auVar81);
    auVar13._4_4_ = fVar97 * fStack_35c;
    auVar13._0_4_ = fVar123 * local_360;
    auVar13._8_4_ = fVar154 * fStack_358;
    auVar13._12_4_ = fVar290 * fStack_354;
    auVar13._16_4_ = fStack_350 * 0.0;
    auVar13._20_4_ = fStack_34c * 0.0;
    auVar13._24_4_ = fStack_348 * 0.0;
    auVar13._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar14._4_4_ = fVar97 * local_280._4_4_;
    auVar14._0_4_ = fVar123 * (float)local_280;
    auVar14._8_4_ = fVar154 * (float)uStack_278;
    auVar14._12_4_ = fVar290 * uStack_278._4_4_;
    auVar14._16_4_ = (float)uStack_270 * 0.0;
    auVar14._20_4_ = uStack_270._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_268 * 0.0;
    auVar14._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar15._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar103._12_4_ * fVar290,
                            CONCAT48(auVar103._8_4_ * fVar154,
                                     CONCAT44(auVar103._4_4_ * fVar97,auVar103._0_4_ * fVar123))));
    auVar186 = vfmadd231ps_fma(auVar15,auVar106,ZEXT1632(auVar186));
    auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar290 * auVar281._12_4_,
                                                  CONCAT48(fVar154 * auVar281._8_4_,
                                                           CONCAT44(fVar97 * auVar281._4_4_,
                                                                    fVar123 * auVar281._0_4_)))),
                               auVar106,ZEXT1632(auVar194));
    auVar219 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar290 * auVar2._12_4_,
                                                  CONCAT48(fVar154 * auVar2._8_4_,
                                                           CONCAT44(fVar97 * auVar2._4_4_,
                                                                    fVar123 * auVar2._0_4_)))),
                               auVar106,ZEXT1632(auVar219));
    auVar161 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar290,
                                                  CONCAT48(auVar130._8_4_ * fVar154,
                                                           CONCAT44(auVar130._4_4_ * fVar97,
                                                                    auVar130._0_4_ * fVar123)))),
                               auVar106,ZEXT1632(auVar161));
    auVar244._0_4_ = fVar123 * (float)local_2a0;
    auVar244._4_4_ = fVar97 * local_2a0._4_4_;
    auVar244._8_4_ = fVar154 * (float)uStack_298;
    auVar244._12_4_ = fVar290 * uStack_298._4_4_;
    auVar244._16_4_ = (float)uStack_290 * 0.0;
    auVar244._20_4_ = uStack_290._4_4_ * 0.0;
    auVar244._24_4_ = (float)uStack_288 * 0.0;
    auVar244._28_4_ = 0;
    auVar140 = vfmadd231ps_fma(auVar13,auVar106,auVar77);
    auVar103 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar140._12_4_ * fVar290,
                                                  CONCAT48(auVar140._8_4_ * fVar154,
                                                           CONCAT44(auVar140._4_4_ * fVar97,
                                                                    auVar140._0_4_ * fVar123)))),
                               auVar106,ZEXT1632(auVar103));
    auVar260._0_4_ = fVar123 * (float)local_2c0;
    auVar260._4_4_ = fVar97 * local_2c0._4_4_;
    auVar260._8_4_ = fVar154 * (float)uStack_2b8;
    auVar260._12_4_ = fVar290 * uStack_2b8._4_4_;
    auVar260._16_4_ = (float)uStack_2b0 * 0.0;
    auVar260._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar260._24_4_ = (float)uStack_2a8 * 0.0;
    auVar260._28_4_ = 0;
    auVar75._4_4_ = fStack_43c;
    auVar75._0_4_ = local_440;
    auVar75._8_4_ = fStack_438;
    auVar75._12_4_ = fStack_434;
    auVar75._16_4_ = fStack_430;
    auVar75._20_4_ = fStack_42c;
    auVar75._24_4_ = fStack_428;
    auVar75._28_4_ = fStack_424;
    auVar140 = vfmadd231ps_fma(auVar14,auVar106,auVar75);
    auVar74._4_4_ = fStack_45c;
    auVar74._0_4_ = local_460;
    auVar74._8_4_ = fStack_458;
    auVar74._12_4_ = fStack_454;
    auVar74._16_4_ = fStack_450;
    auVar74._20_4_ = fStack_44c;
    auVar74._24_4_ = fStack_448;
    auVar74._28_4_ = fStack_444;
    auVar98 = vfmadd231ps_fma(auVar244,auVar106,auVar74);
    auVar240 = vfmadd231ps_fma(auVar260,auVar106,auVar80);
    auVar16._28_4_ = fStack_324;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar240._12_4_ * fVar290,
                            CONCAT48(auVar240._8_4_ * fVar154,
                                     CONCAT44(auVar240._4_4_ * fVar97,auVar240._0_4_ * fVar123))));
    auVar281 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar140._12_4_ * fVar290,
                                                  CONCAT48(auVar140._8_4_ * fVar154,
                                                           CONCAT44(auVar140._4_4_ * fVar97,
                                                                    auVar140._0_4_ * fVar123)))),
                               auVar106,ZEXT1632(auVar281));
    auVar2 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar290 * auVar98._12_4_,
                                                CONCAT48(fVar154 * auVar98._8_4_,
                                                         CONCAT44(fVar97 * auVar98._4_4_,
                                                                  fVar123 * auVar98._0_4_)))),
                             auVar106,ZEXT1632(auVar2));
    auVar130 = vfmadd231ps_fma(auVar16,auVar106,ZEXT1632(auVar130));
    auVar17._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar281._12_4_ * fVar290,
                            CONCAT48(auVar281._8_4_ * fVar154,
                                     CONCAT44(auVar281._4_4_ * fVar97,auVar281._0_4_ * fVar123))));
    auVar140 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar103._12_4_ * fVar290,
                                                  CONCAT48(auVar103._8_4_ * fVar154,
                                                           CONCAT44(auVar103._4_4_ * fVar97,
                                                                    auVar103._0_4_ * fVar123)))),
                               auVar106,ZEXT1632(auVar186));
    auVar98 = vfmadd231ps_fma(auVar17,auVar106,ZEXT1632(auVar194));
    auVar107 = ZEXT1632(auVar98);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar290 * auVar2._12_4_,
                                                 CONCAT48(fVar154 * auVar2._8_4_,
                                                          CONCAT44(fVar97 * auVar2._4_4_,
                                                                   fVar123 * auVar2._0_4_)))),
                              auVar106,ZEXT1632(auVar219));
    auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar290,
                                                  CONCAT48(auVar130._8_4_ * fVar154,
                                                           CONCAT44(auVar130._4_4_ * fVar97,
                                                                    auVar130._0_4_ * fVar123)))),
                               ZEXT1632(auVar161),auVar106);
    auVar262 = ZEXT1664(auVar240);
    auVar169 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar186));
    auVar106 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar194));
    auVar289 = vsubps_avx(ZEXT1632(auVar2),ZEXT1632(auVar219));
    auVar7 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar161));
    local_a00._0_4_ = fVar159 * auVar169._0_4_ * 3.0;
    local_a00._4_4_ = fVar159 * auVar169._4_4_ * 3.0;
    local_a00._8_4_ = fVar159 * auVar169._8_4_ * 3.0;
    local_a00._12_4_ = fVar159 * auVar169._12_4_ * 3.0;
    local_a00._16_4_ = fVar159 * auVar169._16_4_ * 3.0;
    local_a00._20_4_ = fVar159 * auVar169._20_4_ * 3.0;
    local_a00._24_4_ = fVar159 * auVar169._24_4_ * 3.0;
    local_a00._28_4_ = 0;
    local_980._0_4_ = fVar159 * auVar106._0_4_ * 3.0;
    local_980._4_4_ = fVar159 * auVar106._4_4_ * 3.0;
    local_980._8_4_ = fVar159 * auVar106._8_4_ * 3.0;
    local_980._12_4_ = fVar159 * auVar106._12_4_ * 3.0;
    local_980._16_4_ = fVar159 * auVar106._16_4_ * 3.0;
    local_980._20_4_ = fVar159 * auVar106._20_4_ * 3.0;
    local_980._24_4_ = fVar159 * auVar106._24_4_ * 3.0;
    local_980._28_4_ = 0;
    auVar208._0_4_ = fVar159 * auVar289._0_4_ * 3.0;
    auVar208._4_4_ = fVar159 * auVar289._4_4_ * 3.0;
    auVar208._8_4_ = fVar159 * auVar289._8_4_ * 3.0;
    auVar208._12_4_ = fVar159 * auVar289._12_4_ * 3.0;
    auVar208._16_4_ = fVar159 * auVar289._16_4_ * 3.0;
    auVar208._20_4_ = fVar159 * auVar289._20_4_ * 3.0;
    auVar208._24_4_ = fVar159 * auVar289._24_4_ * 3.0;
    local_8e0._28_4_ = 0;
    local_8e0._0_28_ = auVar208;
    auVar280._12_4_ = 0;
    auVar280._0_12_ = auVar208._16_12_;
    fVar123 = fVar159 * auVar7._0_4_ * 3.0;
    fVar154 = fVar159 * auVar7._4_4_ * 3.0;
    auVar18._4_4_ = fVar154;
    auVar18._0_4_ = fVar123;
    fVar155 = fVar159 * auVar7._8_4_ * 3.0;
    auVar18._8_4_ = fVar155;
    fVar156 = fVar159 * auVar7._12_4_ * 3.0;
    auVar18._12_4_ = fVar156;
    fVar157 = fVar159 * auVar7._16_4_ * 3.0;
    auVar18._16_4_ = fVar157;
    fVar158 = fVar159 * auVar7._20_4_ * 3.0;
    auVar18._20_4_ = fVar158;
    fVar159 = fVar159 * auVar7._24_4_ * 3.0;
    auVar18._24_4_ = fVar159;
    auVar18._28_4_ = auVar169._28_4_;
    auVar144 = ZEXT1632(auVar140);
    auVar10 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar140));
    local_9e0 = vpermps_avx2(_DAT_0205d4a0,auVar107);
    local_700 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    local_500 = vsubps_avx(auVar10,auVar144);
    _local_600 = vsubps_avx(local_700,ZEXT1632(auVar98));
    fVar173 = local_600._0_4_;
    fVar174 = local_600._4_4_;
    auVar19._4_4_ = fVar174 * local_a00._4_4_;
    auVar19._0_4_ = fVar173 * (float)local_a00._0_4_;
    fVar175 = local_600._8_4_;
    auVar19._8_4_ = fVar175 * local_a00._8_4_;
    fVar176 = local_600._12_4_;
    auVar19._12_4_ = fVar176 * local_a00._12_4_;
    fVar177 = local_600._16_4_;
    auVar19._16_4_ = fVar177 * local_a00._16_4_;
    fVar216 = local_600._20_4_;
    auVar19._20_4_ = fVar216 * local_a00._20_4_;
    fVar230 = local_600._24_4_;
    auVar19._24_4_ = fVar230 * local_a00._24_4_;
    auVar19._28_4_ = local_700._28_4_;
    auVar186 = vfmsub231ps_fma(auVar19,local_8e0,local_500);
    local_520 = vsubps_avx(local_9e0,auVar107);
    fVar266 = local_500._0_4_;
    fVar270 = local_500._4_4_;
    auVar20._4_4_ = fVar270 * local_980._4_4_;
    auVar20._0_4_ = fVar266 * (float)local_980._0_4_;
    fVar271 = local_500._8_4_;
    auVar20._8_4_ = fVar271 * local_980._8_4_;
    fVar272 = local_500._12_4_;
    auVar20._12_4_ = fVar272 * local_980._12_4_;
    fVar276 = local_500._16_4_;
    auVar20._16_4_ = fVar276 * local_980._16_4_;
    fVar277 = local_500._20_4_;
    auVar20._20_4_ = fVar277 * local_980._20_4_;
    fVar278 = local_500._24_4_;
    auVar20._24_4_ = fVar278 * local_980._24_4_;
    auVar20._28_4_ = auVar10._28_4_;
    auVar194 = vfmsub231ps_fma(auVar20,local_a00,local_520);
    auVar186 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar194._12_4_ * auVar194._12_4_,
                                                  CONCAT48(auVar194._8_4_ * auVar194._8_4_,
                                                           CONCAT44(auVar194._4_4_ * auVar194._4_4_,
                                                                    auVar194._0_4_ * auVar194._0_4_)
                                                          ))),ZEXT1632(auVar186),ZEXT1632(auVar186))
    ;
    fVar203 = local_520._0_4_;
    fVar211 = local_520._4_4_;
    auVar21._4_4_ = fVar211 * auVar208._4_4_;
    auVar21._0_4_ = fVar203 * auVar208._0_4_;
    fVar212 = local_520._8_4_;
    auVar21._8_4_ = fVar212 * auVar208._8_4_;
    fVar213 = local_520._12_4_;
    auVar21._12_4_ = fVar213 * auVar208._12_4_;
    fVar214 = local_520._16_4_;
    auVar21._16_4_ = fVar214 * auVar208._16_4_;
    fVar215 = local_520._20_4_;
    auVar21._20_4_ = fVar215 * auVar208._20_4_;
    fVar231 = local_520._24_4_;
    auVar21._24_4_ = fVar231 * auVar208._24_4_;
    auVar21._28_4_ = local_9e0._28_4_;
    auVar219 = vfmsub231ps_fma(auVar21,local_980,_local_600);
    auVar195._0_4_ = fVar173 * fVar173;
    auVar195._4_4_ = fVar174 * fVar174;
    auVar195._8_4_ = fVar175 * fVar175;
    auVar195._12_4_ = fVar176 * fVar176;
    auVar195._16_4_ = fVar177 * fVar177;
    auVar195._20_4_ = fVar216 * fVar216;
    auVar195._24_4_ = fVar230 * fVar230;
    auVar195._28_4_ = 0;
    auVar194 = vfmadd231ps_fma(auVar195,local_520,local_520);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_500,local_500);
    auVar106 = vrcpps_avx(ZEXT1632(auVar194));
    auVar219 = vfmadd231ps_fma(ZEXT1632(auVar186),ZEXT1632(auVar219),ZEXT1632(auVar219));
    auVar282._8_4_ = 0x3f800000;
    auVar282._0_8_ = &DAT_3f8000003f800000;
    auVar282._12_4_ = 0x3f800000;
    auVar282._16_4_ = 0x3f800000;
    auVar282._20_4_ = 0x3f800000;
    auVar282._24_4_ = 0x3f800000;
    auVar282._28_4_ = 0x3f800000;
    auVar186 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar194),auVar282);
    auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar106,auVar106);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,local_a00);
    local_900 = vpermps_avx2(_DAT_0205d4a0,local_8e0);
    auVar22._4_4_ = local_a20._4_4_ * fVar174;
    auVar22._0_4_ = local_a20._0_4_ * fVar173;
    auVar22._8_4_ = local_a20._8_4_ * fVar175;
    auVar22._12_4_ = local_a20._12_4_ * fVar176;
    auVar22._16_4_ = local_a20._16_4_ * fVar177;
    auVar22._20_4_ = local_a20._20_4_ * fVar216;
    auVar22._24_4_ = local_a20._24_4_ * fVar230;
    auVar22._28_4_ = auVar106._28_4_;
    auVar161 = vfmsub231ps_fma(auVar22,local_900,local_500);
    auVar11 = vpermps_avx2(_DAT_0205d4a0,local_980);
    auVar23._4_4_ = fVar270 * auVar11._4_4_;
    auVar23._0_4_ = fVar266 * auVar11._0_4_;
    auVar23._8_4_ = fVar271 * auVar11._8_4_;
    auVar23._12_4_ = fVar272 * auVar11._12_4_;
    auVar23._16_4_ = fVar276 * auVar11._16_4_;
    auVar23._20_4_ = fVar277 * auVar11._20_4_;
    auVar23._24_4_ = fVar278 * auVar11._24_4_;
    auVar23._28_4_ = 0;
    auVar103 = vfmsub231ps_fma(auVar23,local_a20,local_520);
    auVar161 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar103._12_4_ * auVar103._12_4_,
                                                  CONCAT48(auVar103._8_4_ * auVar103._8_4_,
                                                           CONCAT44(auVar103._4_4_ * auVar103._4_4_,
                                                                    auVar103._0_4_ * auVar103._0_4_)
                                                          ))),ZEXT1632(auVar161),ZEXT1632(auVar161))
    ;
    fVar97 = local_900._0_4_;
    auVar223._0_4_ = fVar203 * fVar97;
    fVar290 = local_900._4_4_;
    auVar223._4_4_ = fVar211 * fVar290;
    fVar291 = local_900._8_4_;
    auVar223._8_4_ = fVar212 * fVar291;
    fVar292 = local_900._12_4_;
    auVar223._12_4_ = fVar213 * fVar292;
    fVar297 = local_900._16_4_;
    auVar223._16_4_ = fVar214 * fVar297;
    fVar298 = local_900._20_4_;
    auVar223._20_4_ = fVar215 * fVar298;
    fVar299 = local_900._24_4_;
    auVar223._24_4_ = fVar231 * fVar299;
    auVar223._28_4_ = 0;
    auVar103 = vfmsub231ps_fma(auVar223,auVar11,_local_600);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT1632(auVar103),ZEXT1632(auVar103));
    auVar106 = vmaxps_avx(ZEXT1632(CONCAT412(auVar219._12_4_ * auVar186._12_4_,
                                             CONCAT48(auVar219._8_4_ * auVar186._8_4_,
                                                      CONCAT44(auVar219._4_4_ * auVar186._4_4_,
                                                               auVar219._0_4_ * auVar186._0_4_)))),
                          ZEXT1632(CONCAT412(auVar161._12_4_ * auVar186._12_4_,
                                             CONCAT48(auVar161._8_4_ * auVar186._8_4_,
                                                      CONCAT44(auVar161._4_4_ * auVar186._4_4_,
                                                               auVar161._0_4_ * auVar186._0_4_)))));
    local_740._0_4_ = auVar240._0_4_ + fVar123;
    local_740._4_4_ = auVar240._4_4_ + fVar154;
    local_740._8_4_ = auVar240._8_4_ + fVar155;
    local_740._12_4_ = auVar240._12_4_ + fVar156;
    local_740._16_4_ = fVar157 + 0.0;
    local_740._20_4_ = fVar158 + 0.0;
    local_740._24_4_ = fVar159 + 0.0;
    local_740._28_4_ = auVar169._28_4_ + 0.0;
    local_920 = ZEXT1632(auVar240);
    auVar169 = vsubps_avx(local_920,auVar18);
    local_760 = vpermps_avx2(_DAT_0205d4a0,auVar169);
    local_780 = vpermps_avx2(_DAT_0205d4a0,local_920);
    auVar169 = vmaxps_avx(local_920,local_740);
    auVar289 = vmaxps_avx(local_760,local_780);
    auVar7 = vrsqrtps_avx(ZEXT1632(auVar194));
    auVar169 = vmaxps_avx(auVar169,auVar289);
    fVar123 = auVar7._0_4_;
    fVar154 = auVar7._4_4_;
    fVar159 = auVar7._8_4_;
    fVar155 = auVar7._12_4_;
    fVar156 = auVar7._16_4_;
    fVar157 = auVar7._20_4_;
    fVar158 = auVar7._24_4_;
    auVar24._4_4_ = fVar154 * fVar154 * fVar154 * auVar194._4_4_ * -0.5;
    auVar24._0_4_ = fVar123 * fVar123 * fVar123 * auVar194._0_4_ * -0.5;
    auVar24._8_4_ = fVar159 * fVar159 * fVar159 * auVar194._8_4_ * -0.5;
    auVar24._12_4_ = fVar155 * fVar155 * fVar155 * auVar194._12_4_ * -0.5;
    auVar24._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar24._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
    auVar24._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
    auVar24._28_4_ = auVar11._28_4_;
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar186 = vfmadd231ps_fma(auVar24,auVar108,auVar7);
    auVar265 = ZEXT1664(auVar186);
    fVar154 = auVar186._0_4_;
    fVar159 = auVar186._4_4_;
    auVar25._4_4_ = fVar211 * fVar159;
    auVar25._0_4_ = fVar203 * fVar154;
    fVar156 = auVar186._8_4_;
    auVar25._8_4_ = fVar212 * fVar156;
    fVar158 = auVar186._12_4_;
    auVar25._12_4_ = fVar213 * fVar158;
    auVar25._16_4_ = fVar214 * 0.0;
    auVar25._20_4_ = fVar215 * 0.0;
    auVar25._24_4_ = fVar231 * 0.0;
    auVar25._28_4_ = 0;
    fVar238 = local_840._0_4_;
    fVar251 = local_840._4_4_;
    auVar26._4_4_ = fVar251 * fVar159 * fVar174;
    auVar26._0_4_ = fVar238 * fVar154 * fVar173;
    fVar252 = local_840._8_4_;
    auVar26._8_4_ = fVar252 * fVar156 * fVar175;
    fVar253 = local_840._12_4_;
    auVar26._12_4_ = fVar253 * fVar158 * fVar176;
    fVar254 = local_840._16_4_;
    auVar26._16_4_ = fVar254 * fVar177 * 0.0;
    fVar255 = local_840._20_4_;
    auVar26._20_4_ = fVar255 * fVar216 * 0.0;
    fVar256 = local_840._24_4_;
    auVar26._24_4_ = fVar256 * fVar230 * 0.0;
    auVar26._28_4_ = local_520._28_4_;
    auVar186 = vfmadd231ps_fma(auVar26,auVar25,_local_800);
    local_5e0 = ZEXT1632(auVar98);
    auVar8 = vsubps_avx(ZEXT832(0) << 0x20,local_5e0);
    fVar203 = auVar8._0_4_;
    fVar211 = auVar8._4_4_;
    auVar27._4_4_ = fVar211 * fVar159 * fVar174;
    auVar27._0_4_ = fVar203 * fVar154 * fVar173;
    fVar212 = auVar8._8_4_;
    auVar27._8_4_ = fVar212 * fVar156 * fVar175;
    fVar213 = auVar8._12_4_;
    auVar27._12_4_ = fVar213 * fVar158 * fVar176;
    fVar214 = auVar8._16_4_;
    auVar27._16_4_ = fVar214 * fVar177 * 0.0;
    fVar215 = auVar8._20_4_;
    auVar27._20_4_ = fVar215 * fVar216 * 0.0;
    fVar216 = auVar8._24_4_;
    auVar27._24_4_ = fVar216 * fVar230 * 0.0;
    auVar27._28_4_ = local_a20._28_4_;
    auVar167 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
    auVar194 = vfmadd231ps_fma(auVar27,auVar167,auVar25);
    auVar28._4_4_ = fVar270 * fVar159;
    auVar28._0_4_ = fVar266 * fVar154;
    auVar28._8_4_ = fVar271 * fVar156;
    auVar28._12_4_ = fVar272 * fVar158;
    auVar28._16_4_ = fVar276 * 0.0;
    auVar28._20_4_ = fVar277 * 0.0;
    auVar28._24_4_ = fVar278 * 0.0;
    auVar28._28_4_ = auVar7._28_4_;
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar28,_local_7e0);
    auVar268 = ZEXT1664(auVar186);
    auVar197 = ZEXT832(0) << 0x20;
    auVar199 = vsubps_avx(auVar197,auVar144);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar199,auVar28);
    auVar29._4_4_ = fVar251 * fVar211;
    auVar29._0_4_ = fVar238 * fVar203;
    auVar29._8_4_ = fVar252 * fVar212;
    auVar29._12_4_ = fVar253 * fVar213;
    auVar29._16_4_ = fVar254 * fVar214;
    auVar29._20_4_ = fVar255 * fVar215;
    auVar29._24_4_ = fVar256 * fVar216;
    auVar29._28_4_ = auVar7._28_4_;
    auVar219 = vfmadd231ps_fma(auVar29,_local_800,auVar167);
    auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),_local_7e0,auVar199);
    fVar123 = auVar194._0_4_;
    fVar266 = auVar186._0_4_;
    fVar155 = auVar194._4_4_;
    fVar270 = auVar186._4_4_;
    fVar157 = auVar194._8_4_;
    fVar271 = auVar186._8_4_;
    fVar173 = auVar194._12_4_;
    fVar272 = auVar186._12_4_;
    auVar30._28_4_ = local_800._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar272 * fVar173,
                            CONCAT48(fVar271 * fVar157,CONCAT44(fVar270 * fVar155,fVar266 * fVar123)
                                    )));
    auVar7 = vsubps_avx(ZEXT1632(auVar219),auVar30);
    auVar31._4_4_ = fVar211 * fVar211;
    auVar31._0_4_ = fVar203 * fVar203;
    auVar31._8_4_ = fVar212 * fVar212;
    auVar31._12_4_ = fVar213 * fVar213;
    auVar31._16_4_ = fVar214 * fVar214;
    auVar31._20_4_ = fVar215 * fVar215;
    auVar31._24_4_ = fVar216 * fVar216;
    auVar31._28_4_ = local_800._28_4_;
    auVar219 = vfmadd231ps_fma(auVar31,auVar167,auVar167);
    auVar219 = vfmadd231ps_fma(ZEXT1632(auVar219),auVar199,auVar199);
    auVar32._28_4_ = local_500._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar173 * fVar173,
                            CONCAT48(fVar157 * fVar157,CONCAT44(fVar155 * fVar155,fVar123 * fVar123)
                                    )));
    auVar9 = vsubps_avx(ZEXT1632(auVar219),auVar32);
    auVar289 = vsqrtps_avx(auVar106);
    fVar177 = auVar169._28_4_ + auVar289._28_4_;
    fVar123 = (auVar169._0_4_ + auVar289._0_4_) * 1.0000002;
    fVar155 = (auVar169._4_4_ + auVar289._4_4_) * 1.0000002;
    fVar157 = (auVar169._8_4_ + auVar289._8_4_) * 1.0000002;
    fVar173 = (auVar169._12_4_ + auVar289._12_4_) * 1.0000002;
    fVar174 = (auVar169._16_4_ + auVar289._16_4_) * 1.0000002;
    fVar175 = (auVar169._20_4_ + auVar289._20_4_) * 1.0000002;
    fVar176 = (auVar169._24_4_ + auVar289._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar155 * fVar155;
    auVar33._0_4_ = fVar123 * fVar123;
    auVar33._8_4_ = fVar157 * fVar157;
    auVar33._12_4_ = fVar173 * fVar173;
    auVar33._16_4_ = fVar174 * fVar174;
    auVar33._20_4_ = fVar175 * fVar175;
    auVar33._24_4_ = fVar176 * fVar176;
    auVar33._28_4_ = fVar177;
    fVar155 = auVar7._0_4_ + auVar7._0_4_;
    fVar157 = auVar7._4_4_ + auVar7._4_4_;
    fVar173 = auVar7._8_4_ + auVar7._8_4_;
    fVar174 = auVar7._12_4_ + auVar7._12_4_;
    fVar175 = auVar7._16_4_ + auVar7._16_4_;
    fVar176 = auVar7._20_4_ + auVar7._20_4_;
    fVar230 = auVar7._24_4_ + auVar7._24_4_;
    fVar231 = auVar7._28_4_ + auVar7._28_4_;
    auVar169 = vsubps_avx(auVar9,auVar33);
    auVar296 = ZEXT3264(auVar169);
    auVar165 = ZEXT1632(auVar186);
    local_560._28_4_ = local_500._28_4_;
    local_560._0_28_ =
         ZEXT1628(CONCAT412(fVar272 * fVar272,
                            CONCAT48(fVar271 * fVar271,CONCAT44(fVar270 * fVar270,fVar266 * fVar266)
                                    )));
    local_620 = vsubps_avx(local_2e0,local_560);
    local_5c0._4_4_ = fVar157 * fVar157;
    local_5c0._0_4_ = fVar155 * fVar155;
    local_5c0._8_4_ = fVar173 * fVar173;
    local_5c0._12_4_ = fVar174 * fVar174;
    local_5c0._16_4_ = fVar175 * fVar175;
    local_5c0._20_4_ = fVar176 * fVar176;
    local_5c0._24_4_ = fVar230 * fVar230;
    local_5c0._28_4_ = fVar231;
    fVar266 = local_620._0_4_;
    fVar270 = local_620._4_4_;
    fVar271 = local_620._8_4_;
    fVar272 = local_620._12_4_;
    fVar276 = local_620._16_4_;
    fVar277 = local_620._20_4_;
    fVar278 = local_620._24_4_;
    auVar34._4_4_ = auVar169._4_4_ * fVar270 * 4.0;
    auVar34._0_4_ = auVar169._0_4_ * fVar266 * 4.0;
    auVar34._8_4_ = auVar169._8_4_ * fVar271 * 4.0;
    auVar34._12_4_ = auVar169._12_4_ * fVar272 * 4.0;
    auVar34._16_4_ = auVar169._16_4_ * fVar276 * 4.0;
    auVar34._20_4_ = auVar169._20_4_ * fVar277 * 4.0;
    auVar34._24_4_ = auVar169._24_4_ * fVar278 * 4.0;
    auVar34._28_4_ = fVar177;
    auVar7 = vsubps_avx(local_5c0,auVar34);
    auVar106 = vcmpps_avx(auVar7,auVar197,5);
    auVar242 = ZEXT1632(auVar194);
    fVar123 = local_620._28_4_;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      fStack_af8 = INFINITY;
      local_b00 = (undefined1  [8])0x7f8000007f800000;
      fStack_af4 = INFINITY;
      uStack_af0 = 0x7f800000;
      uStack_aec = 0x7f800000;
      uStack_ae8 = 0x7f800000;
      uStack_ae4 = 0x7f800000;
      auVar224._8_4_ = 0xff800000;
      auVar224._0_8_ = 0xff800000ff800000;
      auVar224._12_4_ = 0xff800000;
      auVar224._16_4_ = 0xff800000;
      auVar224._20_4_ = 0xff800000;
      auVar224._24_4_ = 0xff800000;
      auVar224._28_4_ = 0xff800000;
      auVar246 = _local_840;
    }
    else {
      auVar66._8_4_ = fVar173;
      auVar66._0_8_ = CONCAT44(fVar157,fVar155);
      auVar66._12_4_ = fVar174;
      auVar66._16_4_ = fVar175;
      auVar66._20_4_ = fVar176;
      auVar66._24_4_ = fVar230;
      auVar66._28_4_ = fVar231;
      auVar259 = vsqrtps_avx(auVar7);
      auVar245._0_4_ = fVar266 + fVar266;
      auVar245._4_4_ = fVar270 + fVar270;
      auVar245._8_4_ = fVar271 + fVar271;
      auVar245._12_4_ = fVar272 + fVar272;
      auVar245._16_4_ = fVar276 + fVar276;
      auVar245._20_4_ = fVar277 + fVar277;
      auVar245._24_4_ = fVar278 + fVar278;
      auVar245._28_4_ = fVar123 + fVar123;
      auVar243 = vrcpps_avx(auVar245);
      auVar197 = vcmpps_avx(auVar7,auVar197,5);
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar186 = vfnmadd213ps_fma(auVar245,auVar243,auVar225);
      auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar243,auVar243);
      auVar109._0_8_ = CONCAT44(fVar157,fVar155) ^ 0x8000000080000000;
      auVar109._8_4_ = -fVar173;
      auVar109._12_4_ = -fVar174;
      auVar109._16_4_ = -fVar175;
      auVar109._20_4_ = -fVar176;
      auVar109._24_4_ = -fVar230;
      auVar109._28_4_ = -fVar231;
      auVar7 = vsubps_avx(auVar109,auVar259);
      auVar35._4_4_ = auVar7._4_4_ * auVar186._4_4_;
      auVar35._0_4_ = auVar7._0_4_ * auVar186._0_4_;
      auVar35._8_4_ = auVar7._8_4_ * auVar186._8_4_;
      auVar35._12_4_ = auVar7._12_4_ * auVar186._12_4_;
      auVar35._16_4_ = auVar7._16_4_ * 0.0;
      auVar35._20_4_ = auVar7._20_4_ * 0.0;
      auVar35._24_4_ = auVar7._24_4_ * 0.0;
      auVar35._28_4_ = auVar7._28_4_;
      auVar7 = vsubps_avx(auVar259,auVar66);
      auVar36._4_4_ = auVar7._4_4_ * auVar186._4_4_;
      auVar36._0_4_ = auVar7._0_4_ * auVar186._0_4_;
      auVar36._8_4_ = auVar7._8_4_ * auVar186._8_4_;
      auVar36._12_4_ = auVar7._12_4_ * auVar186._12_4_;
      auVar36._16_4_ = auVar7._16_4_ * 0.0;
      auVar36._20_4_ = auVar7._20_4_ * 0.0;
      auVar36._24_4_ = auVar7._24_4_ * 0.0;
      auVar36._28_4_ = auVar7._28_4_;
      auVar186 = vfmadd213ps_fma(auVar165,auVar35,auVar242);
      local_4c0 = ZEXT1632(CONCAT412(fVar158 * auVar186._12_4_,
                                     CONCAT48(fVar156 * auVar186._8_4_,
                                              CONCAT44(fVar159 * auVar186._4_4_,
                                                       fVar154 * auVar186._0_4_))));
      auVar186 = vfmadd213ps_fma(auVar165,auVar36,auVar242);
      local_4e0 = ZEXT1632(CONCAT412(fVar158 * auVar186._12_4_,
                                     CONCAT48(fVar156 * auVar186._8_4_,
                                              CONCAT44(fVar159 * auVar186._4_4_,
                                                       fVar154 * auVar186._0_4_))));
      auVar235._8_4_ = 0x7f800000;
      auVar235._0_8_ = 0x7f8000007f800000;
      auVar235._12_4_ = 0x7f800000;
      auVar235._16_4_ = 0x7f800000;
      auVar235._20_4_ = 0x7f800000;
      auVar235._24_4_ = 0x7f800000;
      auVar235._28_4_ = 0x7f800000;
      _local_b00 = vblendvps_avx(auVar235,auVar35,auVar197);
      auVar262 = ZEXT3264(local_560);
      auVar7 = vandps_avx(local_560,local_860);
      auVar7 = vmaxps_avx(local_4a0,auVar7);
      auVar246._8_4_ = 0x36000000;
      auVar246._0_8_ = 0x3600000036000000;
      auVar246._12_4_ = 0x36000000;
      auVar246._16_4_ = 0x36000000;
      auVar246._20_4_ = 0x36000000;
      auVar246._24_4_ = 0x36000000;
      auVar246._28_4_ = 0x36000000;
      auVar37._4_4_ = auVar7._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar7._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar7._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar7._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar7._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar7._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar7._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar7._28_4_;
      auVar7 = vandps_avx(local_620,local_860);
      auVar7 = vcmpps_avx(auVar7,auVar37,1);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar110,auVar36,auVar197);
      auVar243 = auVar197 & auVar7;
      if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar243 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar243 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar243 >> 0x7f,0) != '\0') ||
            (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar243 >> 0xbf,0) != '\0') ||
          (auVar243 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar243[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar197,auVar7);
        auVar7 = vcmpps_avx(auVar169,_DAT_02020f00,2);
        auVar273._8_4_ = 0xff800000;
        auVar273._0_8_ = 0xff800000ff800000;
        auVar273._12_4_ = 0xff800000;
        auVar273._16_4_ = 0xff800000;
        auVar273._20_4_ = 0xff800000;
        auVar273._24_4_ = 0xff800000;
        auVar273._28_4_ = 0xff800000;
        auVar295._8_4_ = 0x7f800000;
        auVar295._0_8_ = 0x7f8000007f800000;
        auVar295._12_4_ = 0x7f800000;
        auVar295._16_4_ = 0x7f800000;
        auVar295._20_4_ = 0x7f800000;
        auVar295._24_4_ = 0x7f800000;
        auVar295._28_4_ = 0x7f800000;
        auVar296 = ZEXT3264(auVar295);
        auVar169 = vblendvps_avx(auVar295,auVar273,auVar7);
        auVar186 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
        auVar243 = vpmovsxwd_avx2(auVar186);
        _local_b00 = vblendvps_avx(_local_b00,auVar169,auVar243);
        auVar249._8_4_ = 0xff800000;
        auVar249._0_8_ = 0xff800000ff800000;
        auVar249._12_4_ = 0xff800000;
        auVar249._16_4_ = 0xff800000;
        auVar249._20_4_ = 0xff800000;
        auVar249._24_4_ = 0xff800000;
        auVar249._28_4_ = 0xff800000;
        auVar246 = vblendvps_avx(auVar249,auVar295,auVar7);
        auVar224 = vblendvps_avx(auVar224,auVar246,auVar243);
        auVar119._0_8_ = auVar106._0_8_ ^ 0xffffffffffffffff;
        auVar119._8_4_ = auVar106._8_4_ ^ 0xffffffff;
        auVar119._12_4_ = auVar106._12_4_ ^ 0xffffffff;
        auVar119._16_4_ = auVar106._16_4_ ^ 0xffffffff;
        auVar119._20_4_ = auVar106._20_4_ ^ 0xffffffff;
        auVar119._24_4_ = auVar106._24_4_ ^ 0xffffffff;
        auVar119._28_4_ = auVar106._28_4_ ^ 0xffffffff;
        auVar106 = vorps_avx(auVar7,auVar119);
        auVar106 = vandps_avx(auVar197,auVar106);
      }
    }
    auVar274 = ZEXT3264(local_560);
    auVar250 = ZEXT3264(auVar246);
    auVar229 = ZEXT3264(auVar224);
    auVar169 = local_480 & auVar106;
    if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar169 >> 0x7f,0) == '\0') &&
          (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar169 >> 0xbf,0) == '\0') &&
        (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar169[0x1f])
    {
LAB_01816c4f:
      auVar169._8_4_ = 0x3f800000;
      auVar169._0_8_ = &DAT_3f8000003f800000;
      auVar169._12_4_ = 0x3f800000;
      auVar169._16_4_ = 0x3f800000;
      auVar169._20_4_ = 0x3f800000;
      auVar169._24_4_ = 0x3f800000;
      auVar169._28_4_ = 0x3f800000;
    }
    else {
      fVar177 = *(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_;
      auVar111._4_4_ = fVar177;
      auVar111._0_4_ = fVar177;
      auVar111._8_4_ = fVar177;
      auVar111._12_4_ = fVar177;
      auVar111._16_4_ = fVar177;
      auVar111._20_4_ = fVar177;
      auVar111._24_4_ = fVar177;
      auVar111._28_4_ = fVar177;
      local_540 = vminps_avx(auVar111,auVar224);
      auVar38._4_4_ = fVar211 * auVar208._4_4_;
      auVar38._0_4_ = fVar203 * auVar208._0_4_;
      auVar38._8_4_ = fVar212 * auVar208._8_4_;
      auVar38._12_4_ = fVar213 * auVar208._12_4_;
      auVar38._16_4_ = fVar214 * auVar208._16_4_;
      auVar38._20_4_ = fVar215 * auVar208._20_4_;
      auVar38._24_4_ = fVar216 * auVar208._24_4_;
      auVar38._28_4_ = auVar8._28_4_;
      auVar186 = vfmadd213ps_fma(auVar167,local_980,auVar38);
      auVar194 = vfmadd213ps_fma(auVar199,local_a00,ZEXT1632(auVar186));
      auVar39._4_4_ = auVar208._4_4_ * fVar251;
      auVar39._0_4_ = auVar208._0_4_ * fVar238;
      auVar39._8_4_ = auVar208._8_4_ * fVar252;
      auVar39._12_4_ = auVar208._12_4_ * fVar253;
      auVar39._16_4_ = auVar208._16_4_ * fVar254;
      auVar39._20_4_ = auVar208._20_4_ * fVar255;
      auVar39._24_4_ = auVar208._24_4_ * fVar256;
      auVar39._28_4_ = 0;
      auVar186 = vfmadd231ps_fma(auVar39,_local_800,local_980);
      auVar219 = vfmadd231ps_fma(ZEXT1632(auVar186),_local_7e0,local_a00);
      auVar169 = vandps_avx(local_860,ZEXT1632(auVar219));
      auVar286._8_4_ = 0x219392ef;
      auVar286._0_8_ = 0x219392ef219392ef;
      auVar286._12_4_ = 0x219392ef;
      auVar286._16_4_ = 0x219392ef;
      auVar286._20_4_ = 0x219392ef;
      auVar286._24_4_ = 0x219392ef;
      auVar286._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar169,auVar286,1);
      auVar262 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar7 = vrcpps_avx(ZEXT1632(auVar219));
      auVar169._8_4_ = 0x3f800000;
      auVar169._0_8_ = &DAT_3f8000003f800000;
      auVar169._12_4_ = 0x3f800000;
      auVar169._16_4_ = 0x3f800000;
      auVar169._20_4_ = 0x3f800000;
      auVar169._24_4_ = 0x3f800000;
      auVar169._28_4_ = 0x3f800000;
      auVar296 = ZEXT3264(auVar169);
      auVar199 = ZEXT1632(auVar219);
      auVar186 = vfnmadd213ps_fma(auVar7,auVar199,auVar169);
      auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar7,auVar7);
      auVar196._0_8_ = auVar219._0_8_ ^ 0x8000000080000000;
      auVar196._8_4_ = auVar219._8_4_ ^ 0x80000000;
      auVar196._12_4_ = auVar219._12_4_ ^ 0x80000000;
      auVar196._16_4_ = 0x80000000;
      auVar196._20_4_ = 0x80000000;
      auVar196._24_4_ = 0x80000000;
      auVar196._28_4_ = 0x80000000;
      auVar247._0_4_ = auVar186._0_4_ * -auVar194._0_4_;
      auVar247._4_4_ = auVar186._4_4_ * -auVar194._4_4_;
      auVar247._8_4_ = auVar186._8_4_ * -auVar194._8_4_;
      auVar247._12_4_ = auVar186._12_4_ * -auVar194._12_4_;
      auVar247._16_4_ = 0x80000000;
      auVar247._20_4_ = 0x80000000;
      auVar247._24_4_ = 0x80000000;
      auVar247._28_4_ = 0;
      auVar7 = vcmpps_avx(auVar199,auVar196,1);
      auVar7 = vorps_avx(auVar8,auVar7);
      auVar287._8_4_ = 0xff800000;
      auVar287._0_8_ = 0xff800000ff800000;
      auVar287._12_4_ = 0xff800000;
      auVar287._16_4_ = 0xff800000;
      auVar287._20_4_ = 0xff800000;
      auVar287._24_4_ = 0xff800000;
      auVar287._28_4_ = 0xff800000;
      auVar7 = vblendvps_avx(auVar247,auVar287,auVar7);
      auVar76._4_4_ = fStack_37c;
      auVar76._0_4_ = local_380;
      auVar76._8_4_ = fStack_378;
      auVar76._12_4_ = fStack_374;
      auVar76._16_4_ = fStack_370;
      auVar76._20_4_ = fStack_36c;
      auVar76._24_4_ = fStack_368;
      auVar76._28_4_ = fStack_364;
      auVar167 = vmaxps_avx(auVar76,_local_b00);
      auVar167 = vmaxps_avx(auVar167,auVar7);
      auVar7 = vcmpps_avx(auVar199,auVar196,6);
      auVar7 = vorps_avx(auVar8,auVar7);
      auVar288._8_4_ = 0x7f800000;
      auVar288._0_8_ = 0x7f8000007f800000;
      auVar288._12_4_ = 0x7f800000;
      auVar288._16_4_ = 0x7f800000;
      auVar288._20_4_ = 0x7f800000;
      auVar288._24_4_ = 0x7f800000;
      auVar288._28_4_ = 0x7f800000;
      auVar7 = vblendvps_avx(auVar247,auVar288,auVar7);
      auVar199 = vminps_avx(local_540,auVar7);
      auVar7 = vsubps_avx(ZEXT832(0) << 0x20,local_9e0);
      auVar8 = vsubps_avx(ZEXT832(0) << 0x20,local_700);
      auVar40._4_4_ = auVar8._4_4_ * fVar290;
      auVar40._0_4_ = auVar8._0_4_ * fVar97;
      auVar40._8_4_ = auVar8._8_4_ * fVar291;
      auVar40._12_4_ = auVar8._12_4_ * fVar292;
      auVar40._16_4_ = auVar8._16_4_ * fVar297;
      auVar40._20_4_ = auVar8._20_4_ * fVar298;
      auVar40._24_4_ = auVar8._24_4_ * fVar299;
      auVar40._28_4_ = auVar8._28_4_;
      auVar186 = vfnmsub231ps_fma(auVar40,auVar11,auVar7);
      auVar7 = vsubps_avx(ZEXT832(0) << 0x20,auVar10);
      auVar194 = vfnmadd231ps_fma(ZEXT1632(auVar186),local_a20,auVar7);
      auVar41._4_4_ = fVar290 * fVar251;
      auVar41._0_4_ = fVar97 * fVar238;
      auVar41._8_4_ = fVar291 * fVar252;
      auVar41._12_4_ = fVar292 * fVar253;
      auVar41._16_4_ = fVar297 * fVar254;
      auVar41._20_4_ = fVar298 * fVar255;
      auVar41._24_4_ = fVar299 * fVar256;
      auVar41._28_4_ = auVar7._28_4_;
      auVar186 = vfnmsub231ps_fma(auVar41,_local_800,auVar11);
      auVar219 = vfnmadd231ps_fma(ZEXT1632(auVar186),_local_7e0,local_a20);
      auVar7 = vandps_avx(local_860,ZEXT1632(auVar219));
      auVar11 = vrcpps_avx(ZEXT1632(auVar219));
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar8 = vcmpps_avx(auVar7,auVar112,1);
      auVar197 = ZEXT1632(auVar219);
      auVar186 = vfnmadd213ps_fma(auVar11,auVar197,auVar169);
      auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar11,auVar11);
      auVar248._0_8_ = auVar219._0_8_ ^ 0x8000000080000000;
      auVar248._8_4_ = auVar219._8_4_ ^ 0x80000000;
      auVar248._12_4_ = auVar219._12_4_ ^ 0x80000000;
      auVar248._16_4_ = 0x80000000;
      auVar248._20_4_ = 0x80000000;
      auVar248._24_4_ = 0x80000000;
      auVar248._28_4_ = 0x80000000;
      auVar250 = ZEXT3264(auVar248);
      auVar42._4_4_ = auVar186._4_4_ * -auVar194._4_4_;
      auVar42._0_4_ = auVar186._0_4_ * -auVar194._0_4_;
      auVar42._8_4_ = auVar186._8_4_ * -auVar194._8_4_;
      auVar42._12_4_ = auVar186._12_4_ * -auVar194._12_4_;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar229 = ZEXT3264(auVar42);
      auVar7 = vcmpps_avx(auVar197,auVar248,1);
      auVar7 = vorps_avx(auVar7,auVar8);
      auVar113._8_4_ = 0xff800000;
      auVar113._0_8_ = 0xff800000ff800000;
      auVar113._12_4_ = 0xff800000;
      auVar113._16_4_ = 0xff800000;
      auVar113._20_4_ = 0xff800000;
      auVar113._24_4_ = 0xff800000;
      auVar113._28_4_ = 0xff800000;
      auVar7 = vblendvps_avx(auVar42,auVar113,auVar7);
      auVar274 = ZEXT3264(auVar7);
      local_a40 = vmaxps_avx(auVar167,auVar7);
      auVar7 = vcmpps_avx(auVar197,auVar248,6);
      auVar7 = vorps_avx(auVar8,auVar7);
      auVar114._8_4_ = 0x7f800000;
      auVar114._0_8_ = 0x7f8000007f800000;
      auVar114._12_4_ = 0x7f800000;
      auVar114._16_4_ = 0x7f800000;
      auVar114._20_4_ = 0x7f800000;
      auVar114._24_4_ = 0x7f800000;
      auVar114._28_4_ = 0x7f800000;
      auVar7 = vblendvps_avx(auVar42,auVar114,auVar7);
      auVar106 = vandps_avx(auVar106,local_480);
      local_3c0 = vminps_avx(auVar199,auVar7);
      auVar7 = vcmpps_avx(local_a40,local_3c0,2);
      auVar8 = auVar106 & auVar7;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar8 = vminps_avx(local_4c0,auVar169);
        auVar208 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar8 = vmaxps_avx(auVar8,ZEXT832(0) << 0x20);
        auVar167 = vminps_avx(local_4e0,auVar169);
        auVar167 = vmaxps_avx(auVar167,ZEXT832(0) << 0x20);
        auVar44._4_4_ = (auVar8._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar8._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar8._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar8._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar8._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar8._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar8._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar8._28_4_ + 7.0;
        auVar186 = vfmadd213ps_fma(auVar44,local_720,local_9a0);
        auVar45._4_4_ = (auVar167._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar167._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar167._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar167._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar167._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar167._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar167._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar167._28_4_ + 7.0;
        auVar194 = vfmadd213ps_fma(auVar45,local_720,local_9a0);
        auVar8 = vminps_avx(local_920,local_740);
        auVar167 = vminps_avx(local_760,local_780);
        auVar8 = vminps_avx(auVar8,auVar167);
        auVar289 = vsubps_avx(auVar8,auVar289);
        auVar106 = vandps_avx(auVar7,auVar106);
        local_4c0 = ZEXT1632(auVar186);
        local_4e0 = ZEXT1632(auVar194);
        auVar46._4_4_ = auVar289._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar289._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar289._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar289._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar289._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar289._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar289._24_4_ * 0.99999976;
        auVar46._28_4_ = 0x3f7ffffc;
        auVar289 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
        auVar47._4_4_ = auVar289._4_4_ * auVar289._4_4_;
        auVar47._0_4_ = auVar289._0_4_ * auVar289._0_4_;
        auVar47._8_4_ = auVar289._8_4_ * auVar289._8_4_;
        auVar47._12_4_ = auVar289._12_4_ * auVar289._12_4_;
        auVar47._16_4_ = auVar289._16_4_ * auVar289._16_4_;
        auVar47._20_4_ = auVar289._20_4_ * auVar289._20_4_;
        auVar47._24_4_ = auVar289._24_4_ * auVar289._24_4_;
        auVar47._28_4_ = auVar289._28_4_;
        auVar7 = vsubps_avx(auVar9,auVar47);
        auVar274 = ZEXT3264(auVar7);
        auVar48._4_4_ = auVar7._4_4_ * fVar270 * 4.0;
        auVar48._0_4_ = auVar7._0_4_ * fVar266 * 4.0;
        auVar48._8_4_ = auVar7._8_4_ * fVar271 * 4.0;
        auVar48._12_4_ = auVar7._12_4_ * fVar272 * 4.0;
        auVar48._16_4_ = auVar7._16_4_ * fVar276 * 4.0;
        auVar48._20_4_ = auVar7._20_4_ * fVar277 * 4.0;
        auVar48._24_4_ = auVar7._24_4_ * fVar278 * 4.0;
        auVar48._28_4_ = auVar289._28_4_;
        auVar8 = vsubps_avx(local_5c0,auVar48);
        auVar59 = ZEXT412(0);
        auVar167 = ZEXT1232(auVar59) << 0x20;
        local_880 = ZEXT1232(auVar59) << 0x20;
        local_960 = vcmpps_avx(auVar8,ZEXT832(0) << 0x20,5);
        auVar289 = local_960;
        if ((((((((local_960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_960 >> 0x7f,0) == '\0') &&
              (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_960 >> 0xbf,0) == '\0') &&
            (local_960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_960[0x1f]) {
          local_5e0 = local_880;
          _local_600 = ZEXT1232(auVar59) << 0x20;
          auVar199 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          local_960 = auVar10;
        }
        else {
          auVar168._0_4_ = fVar266 + fVar266;
          auVar168._4_4_ = fVar270 + fVar270;
          auVar168._8_4_ = fVar271 + fVar271;
          auVar168._12_4_ = fVar272 + fVar272;
          auVar168._16_4_ = fVar276 + fVar276;
          auVar168._20_4_ = fVar277 + fVar277;
          auVar168._24_4_ = fVar278 + fVar278;
          auVar168._28_4_ = fVar123 + fVar123;
          auVar167 = vrcpps_avx(auVar168);
          auVar186 = vfnmadd213ps_fma(auVar168,auVar167,auVar169);
          auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar167,auVar167);
          auVar169 = vsqrtps_avx(auVar8);
          auVar67._4_4_ = fVar157;
          auVar67._0_4_ = fVar155;
          auVar67._8_4_ = fVar173;
          auVar67._12_4_ = fVar174;
          auVar67._16_4_ = fVar175;
          auVar67._20_4_ = fVar176;
          auVar67._24_4_ = fVar230;
          auVar67._28_4_ = fVar231;
          auVar209._0_8_ = CONCAT44(fVar157,fVar155) ^ 0x8000000080000000;
          auVar209._8_4_ = -fVar173;
          auVar209._12_4_ = -fVar174;
          auVar209._16_4_ = -fVar175;
          auVar209._20_4_ = -fVar176;
          auVar209._24_4_ = -fVar230;
          auVar209._28_4_ = -fVar231;
          auVar167 = vsubps_avx(auVar209,auVar169);
          auVar169 = vsubps_avx(auVar169,auVar67);
          fVar173 = auVar167._0_4_ * auVar186._0_4_;
          fVar297 = auVar167._4_4_ * auVar186._4_4_;
          auVar49._4_4_ = fVar297;
          auVar49._0_4_ = fVar173;
          fVar298 = auVar167._8_4_ * auVar186._8_4_;
          auVar49._8_4_ = fVar298;
          fVar299 = auVar167._12_4_ * auVar186._12_4_;
          auVar49._12_4_ = fVar299;
          fVar174 = auVar167._16_4_ * 0.0;
          auVar49._16_4_ = fVar174;
          fVar175 = auVar167._20_4_ * 0.0;
          auVar49._20_4_ = fVar175;
          fVar176 = auVar167._24_4_ * 0.0;
          auVar49._24_4_ = fVar176;
          auVar49._28_4_ = 0x3f800000;
          auVar296 = ZEXT3264(auVar49);
          fVar123 = auVar169._0_4_ * auVar186._0_4_;
          fVar97 = auVar169._4_4_ * auVar186._4_4_;
          auVar50._4_4_ = fVar97;
          auVar50._0_4_ = fVar123;
          fVar290 = auVar169._8_4_ * auVar186._8_4_;
          auVar50._8_4_ = fVar290;
          fVar155 = auVar169._12_4_ * auVar186._12_4_;
          auVar50._12_4_ = fVar155;
          fVar291 = auVar169._16_4_ * 0.0;
          auVar50._16_4_ = fVar291;
          fVar157 = auVar169._20_4_ * 0.0;
          auVar50._20_4_ = fVar157;
          fVar292 = auVar169._24_4_ * 0.0;
          auVar50._24_4_ = fVar292;
          auVar50._28_4_ = local_960._28_4_;
          auVar186 = vfmadd213ps_fma(auVar165,auVar49,auVar242);
          auVar194 = vfmadd213ps_fma(auVar165,auVar50,auVar242);
          auVar51._28_4_ = auVar167._28_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar158 * auVar186._12_4_,
                                  CONCAT48(fVar156 * auVar186._8_4_,
                                           CONCAT44(fVar159 * auVar186._4_4_,
                                                    fVar154 * auVar186._0_4_))));
          auVar169 = ZEXT1632(CONCAT412(fVar158 * auVar194._12_4_,
                                        CONCAT48(fVar156 * auVar194._8_4_,
                                                 CONCAT44(fVar159 * auVar194._4_4_,
                                                          fVar154 * auVar194._0_4_))));
          auVar186 = vfmadd213ps_fma(local_500,auVar51,auVar144);
          auVar194 = vfmadd213ps_fma(local_500,auVar169,auVar144);
          auVar219 = vfmadd213ps_fma(local_520,auVar51,auVar107);
          auVar161 = vfmadd213ps_fma(local_520,auVar169,auVar107);
          auVar103 = vfmadd213ps_fma(auVar51,_local_600,local_5e0);
          auVar281 = vfmadd213ps_fma(_local_600,auVar169,local_5e0);
          auVar52._4_4_ = fVar297 * (float)local_7e0._4_4_;
          auVar52._0_4_ = fVar173 * (float)local_7e0._0_4_;
          auVar52._8_4_ = fVar298 * fStack_7d8;
          auVar52._12_4_ = fVar299 * fStack_7d4;
          auVar52._16_4_ = fVar174 * fStack_7d0;
          auVar52._20_4_ = fVar175 * fStack_7cc;
          auVar52._24_4_ = fVar176 * fStack_7c8;
          auVar52._28_4_ = 0;
          auVar167 = vsubps_avx(auVar52,ZEXT1632(auVar186));
          auVar200._0_4_ = fVar173 * (float)local_800._0_4_;
          auVar200._4_4_ = fVar297 * (float)local_800._4_4_;
          auVar200._8_4_ = fVar298 * fStack_7f8;
          auVar200._12_4_ = fVar299 * fStack_7f4;
          auVar200._16_4_ = fVar174 * fStack_7f0;
          auVar200._20_4_ = fVar175 * fStack_7ec;
          auVar200._24_4_ = fVar176 * fStack_7e8;
          auVar200._28_4_ = 0;
          auVar199 = vsubps_avx(auVar200,ZEXT1632(auVar219));
          auVar227._0_4_ = fVar238 * fVar173;
          auVar227._4_4_ = fVar251 * fVar297;
          auVar227._8_4_ = fVar252 * fVar298;
          auVar227._12_4_ = fVar253 * fVar299;
          auVar227._16_4_ = fVar254 * fVar174;
          auVar227._20_4_ = fVar255 * fVar175;
          auVar227._24_4_ = fVar256 * fVar176;
          auVar227._28_4_ = 0;
          auVar169 = vsubps_avx(auVar227,ZEXT1632(auVar103));
          auVar208 = auVar169._0_28_;
          auVar53._4_4_ = fVar97 * (float)local_7e0._4_4_;
          auVar53._0_4_ = fVar123 * (float)local_7e0._0_4_;
          auVar53._8_4_ = fVar290 * fStack_7d8;
          auVar53._12_4_ = fVar155 * fStack_7d4;
          auVar53._16_4_ = fVar291 * fStack_7d0;
          auVar53._20_4_ = fVar157 * fStack_7cc;
          auVar53._24_4_ = fVar292 * fStack_7c8;
          auVar53._28_4_ = 0;
          local_880 = vsubps_avx(auVar53,ZEXT1632(auVar194));
          auVar54._4_4_ = fVar97 * (float)local_800._4_4_;
          auVar54._0_4_ = fVar123 * (float)local_800._0_4_;
          auVar54._8_4_ = fVar290 * fStack_7f8;
          auVar54._12_4_ = fVar155 * fStack_7f4;
          auVar54._16_4_ = fVar291 * fStack_7f0;
          auVar54._20_4_ = fVar157 * fStack_7ec;
          auVar54._24_4_ = fVar292 * fStack_7e8;
          auVar54._28_4_ = local_880._28_4_;
          local_5e0 = vsubps_avx(auVar54,ZEXT1632(auVar161));
          auVar55._4_4_ = fVar251 * fVar97;
          auVar55._0_4_ = fVar238 * fVar123;
          auVar55._8_4_ = fVar252 * fVar290;
          auVar55._12_4_ = fVar253 * fVar155;
          auVar55._16_4_ = fVar254 * fVar291;
          auVar55._20_4_ = fVar255 * fVar157;
          auVar55._24_4_ = fVar256 * fVar292;
          auVar55._28_4_ = local_5e0._28_4_;
          _local_600 = vsubps_avx(auVar55,ZEXT1632(auVar281));
          auVar268 = ZEXT864(0) << 0x20;
          auVar8 = vcmpps_avx(auVar8,_DAT_02020f00,5);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar226 = vblendvps_avx(auVar228,auVar49,auVar8);
          auVar169 = vandps_avx(local_860,local_560);
          auVar169 = vmaxps_avx(local_4a0,auVar169);
          auVar56._4_4_ = auVar169._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar169._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar169._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar169._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar169._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar169._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar169._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar169._28_4_;
          auVar169 = vandps_avx(local_860,local_620);
          auVar169 = vcmpps_avx(auVar169,auVar56,1);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar236 = vblendvps_avx(auVar237,auVar50,auVar8);
          auVar10 = auVar8 & auVar169;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar169 = vandps_avx(auVar169,auVar8);
            auVar7 = vcmpps_avx(auVar7,ZEXT832(0) << 0x20,2);
            auVar268 = ZEXT3264(auVar7);
            auVar279._8_4_ = 0xff800000;
            auVar279._0_8_ = 0xff800000ff800000;
            auVar279._12_4_ = 0xff800000;
            auVar279._16_4_ = 0xff800000;
            auVar279._20_4_ = 0xff800000;
            auVar279._24_4_ = 0xff800000;
            auVar279._28_4_ = 0xff800000;
            auVar283._8_4_ = 0x7f800000;
            auVar283._0_8_ = 0x7f8000007f800000;
            auVar283._12_4_ = 0x7f800000;
            auVar283._16_4_ = 0x7f800000;
            auVar283._20_4_ = 0x7f800000;
            auVar283._24_4_ = 0x7f800000;
            auVar283._28_4_ = 0x7f800000;
            auVar289 = vblendvps_avx(auVar283,auVar279,auVar7);
            auVar186 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
            auVar10 = vpmovsxwd_avx2(auVar186);
            auVar226 = vblendvps_avx(auVar226,auVar289,auVar10);
            auVar289 = vblendvps_avx(auVar279,auVar283,auVar7);
            auVar274 = ZEXT3264(auVar289);
            auVar236 = vblendvps_avx(auVar236,auVar289,auVar10);
            auVar261._0_8_ = auVar169._0_8_ ^ 0xffffffffffffffff;
            auVar261._8_4_ = auVar169._8_4_ ^ 0xffffffff;
            auVar261._12_4_ = auVar169._12_4_ ^ 0xffffffff;
            auVar261._16_4_ = auVar169._16_4_ ^ 0xffffffff;
            auVar261._20_4_ = auVar169._20_4_ ^ 0xffffffff;
            auVar261._24_4_ = auVar169._24_4_ ^ 0xffffffff;
            auVar261._28_4_ = auVar169._28_4_ ^ 0xffffffff;
            auVar169 = vorps_avx(auVar7,auVar261);
            auVar289 = vandps_avx(auVar169,auVar8);
          }
        }
        auVar262 = ZEXT3264(local_a40);
        local_420 = local_a40;
        local_400 = vminps_avx(local_3c0,auVar226);
        _local_3e0 = vmaxps_avx(local_a40,auVar236);
        auVar265 = ZEXT3264(_local_3e0);
        auVar169 = vcmpps_avx(local_a40,local_400,2);
        local_500 = vandps_avx(auVar169,auVar106);
        auVar229 = ZEXT3264(local_500);
        local_580 = local_500;
        auVar169 = vcmpps_avx(_local_3e0,local_3c0,2);
        local_5a0 = vandps_avx(auVar169,auVar106);
        auVar250 = ZEXT3264(local_5a0);
        auVar106 = vorps_avx(local_5a0,local_500);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          local_540 = local_5a0;
          local_620._0_8_ = auVar289._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar289._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar289._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar289._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar289._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar289._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar289._28_4_ ^ 0xffffffff;
          auVar229 = ZEXT3264(local_620);
          auVar57._4_4_ = auVar208._4_4_ * fVar251;
          auVar57._0_4_ = auVar208._0_4_ * fVar238;
          auVar57._8_4_ = auVar208._8_4_ * fVar252;
          auVar57._12_4_ = auVar208._12_4_ * fVar253;
          auVar57._16_4_ = auVar208._16_4_ * fVar254;
          auVar57._20_4_ = auVar208._20_4_ * fVar255;
          auVar57._24_4_ = auVar208._24_4_ * fVar256;
          auVar57._28_4_ = auVar106._28_4_;
          auVar186 = vfmadd132ps_fma(auVar199,auVar57,_local_800);
          auVar186 = vfmadd132ps_fma(auVar167,ZEXT1632(auVar186),_local_7e0);
          auVar106 = vandps_avx(ZEXT1632(auVar186),local_860);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar106 = vcmpps_avx(auVar106,auVar146,1);
          auVar106 = vorps_avx(auVar106,local_620);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar106 = vblendvps_avx(auVar170,auVar147,auVar106);
          uVar93 = (undefined4)uVar94;
          local_560._4_4_ = uVar93;
          local_560._0_4_ = uVar93;
          local_560._8_4_ = uVar93;
          local_560._12_4_ = uVar93;
          local_560._16_4_ = uVar93;
          local_560._20_4_ = uVar93;
          local_560._24_4_ = uVar93;
          local_560._28_4_ = uVar93;
          local_520 = vpcmpgtd_avx2(auVar106,local_560);
          local_580 = vpandn_avx2(local_520,local_500);
          auVar106 = local_500 & ~local_520;
          local_5c0._0_8_ = uVar94;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            auVar194 = vminps_avx(local_a80,local_aa0);
            auVar186 = vmaxps_avx(local_a80,local_aa0);
            auVar219 = vminps_avx(local_a90,_local_ab0);
            auVar161 = vminps_avx(auVar194,auVar219);
            auVar194 = vmaxps_avx(local_a90,_local_ab0);
            auVar219 = vmaxps_avx(auVar186,auVar194);
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            local_720._0_16_ = auVar178;
            auVar186 = vandps_avx(auVar161,auVar178);
            auVar194 = vandps_avx(auVar219,auVar178);
            auVar186 = vmaxps_avx(auVar186,auVar194);
            auVar194 = vmovshdup_avx(auVar186);
            auVar194 = vmaxss_avx(auVar194,auVar186);
            auVar186 = vshufpd_avx(auVar186,auVar186,1);
            auVar186 = vmaxss_avx(auVar186,auVar194);
            local_960._0_4_ = auVar186._0_4_ * 1.9073486e-06;
            _local_7c0 = vshufps_avx(auVar219,auVar219,0xff);
            _auStack_7b0 = auVar9._16_16_;
            local_820._4_4_ = local_a40._4_4_ + (float)local_7a0._4_4_;
            local_820._0_4_ = local_a40._0_4_ + (float)local_7a0._0_4_;
            fStack_818 = local_a40._8_4_ + fStack_798;
            fStack_814 = local_a40._12_4_ + fStack_794;
            fStack_810 = local_a40._16_4_ + fStack_790;
            fStack_80c = local_a40._20_4_ + fStack_78c;
            fStack_808 = local_a40._24_4_ + fStack_788;
            fStack_804 = local_a40._28_4_ + fStack_784;
            local_9a0 = _local_3e0;
            do {
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar106 = vblendvps_avx(auVar148,auVar262._0_32_,local_580);
              auVar169 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar169 = vminps_avx(auVar106,auVar169);
              auVar289 = vshufpd_avx(auVar169,auVar169,5);
              auVar169 = vminps_avx(auVar169,auVar289);
              auVar289 = vpermpd_avx2(auVar169,0x4e);
              auVar169 = vminps_avx(auVar169,auVar289);
              auVar169 = vcmpps_avx(auVar106,auVar169,0);
              auVar289 = local_580 & auVar169;
              auVar106 = local_580;
              if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar289 >> 0x7f,0) != '\0') ||
                    (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar289 >> 0xbf,0) != '\0') ||
                  (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar289[0x1f] < '\0') {
                auVar106 = vandps_avx(auVar169,local_580);
              }
              uVar92 = vmovmskps_avx(auVar106);
              iVar12 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar87 = iVar12 << 2;
              *(undefined4 *)(local_580 + uVar87) = 0;
              uVar92 = *(uint *)(local_4c0 + uVar87);
              uVar87 = *(uint *)(local_420 + uVar87);
              fVar123 = local_ab4;
              if ((float)local_940._0_4_ < 0.0) {
                fVar123 = sqrtf((float)local_940._0_4_);
              }
              auVar268 = ZEXT464(uVar87);
              auVar202 = ZEXT464(uVar92);
              local_900._0_4_ = fVar123 * 1.9073486e-06;
              lVar91 = 4;
              do {
                fVar154 = auVar202._0_4_;
                fVar97 = 1.0 - fVar154;
                local_9e0._0_16_ = ZEXT416((uint)fVar97);
                auVar124._0_4_ = local_aa0._0_4_ * fVar154;
                auVar124._4_4_ = local_aa0._4_4_ * fVar154;
                auVar124._8_4_ = local_aa0._8_4_ * fVar154;
                auVar124._12_4_ = local_aa0._12_4_ * fVar154;
                auVar160._4_4_ = fVar97;
                auVar160._0_4_ = fVar97;
                auVar160._8_4_ = fVar97;
                auVar160._12_4_ = fVar97;
                auVar186 = vfmadd231ps_fma(auVar124,auVar160,local_a80);
                auVar179._0_4_ = local_a90._0_4_ * fVar154;
                auVar179._4_4_ = local_a90._4_4_ * fVar154;
                auVar179._8_4_ = local_a90._8_4_ * fVar154;
                auVar179._12_4_ = local_a90._12_4_ * fVar154;
                auVar194 = vfmadd231ps_fma(auVar179,auVar160,local_aa0);
                auVar218._0_4_ = fVar154 * auVar194._0_4_;
                auVar218._4_4_ = fVar154 * auVar194._4_4_;
                auVar218._8_4_ = fVar154 * auVar194._8_4_;
                auVar218._12_4_ = fVar154 * auVar194._12_4_;
                auVar219 = vfmadd231ps_fma(auVar218,auVar160,auVar186);
                auVar125._0_4_ = fVar154 * (float)local_ab0._0_4_;
                auVar125._4_4_ = fVar154 * (float)local_ab0._4_4_;
                auVar125._8_4_ = fVar154 * fStack_aa8;
                auVar125._12_4_ = fVar154 * fStack_aa4;
                auVar186 = vfmadd231ps_fma(auVar125,auVar160,local_a90);
                auVar204._0_4_ = fVar154 * auVar186._0_4_;
                auVar204._4_4_ = fVar154 * auVar186._4_4_;
                auVar204._8_4_ = fVar154 * auVar186._8_4_;
                auVar204._12_4_ = fVar154 * auVar186._12_4_;
                auVar161 = vfmadd231ps_fma(auVar204,auVar160,auVar194);
                fVar123 = auVar268._0_4_;
                auVar126._4_4_ = fVar123;
                auVar126._0_4_ = fVar123;
                auVar126._8_4_ = fVar123;
                auVar126._12_4_ = fVar123;
                auVar186 = vfmadd213ps_fma(auVar126,local_930,_DAT_01feba10);
                auVar99._0_4_ = fVar154 * auVar161._0_4_;
                auVar99._4_4_ = fVar154 * auVar161._4_4_;
                auVar99._8_4_ = fVar154 * auVar161._8_4_;
                auVar99._12_4_ = fVar154 * auVar161._12_4_;
                auVar194 = vfmadd231ps_fma(auVar99,auVar219,auVar160);
                local_700._0_16_ = auVar194;
                auVar194 = vsubps_avx(auVar186,auVar194);
                auVar186 = vdpps_avx(auVar194,auVar194,0x7f);
                fVar290 = auVar186._0_4_;
                if (fVar290 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar97);
                  local_a00._0_16_ = auVar219;
                  local_980._0_16_ = auVar161;
                  auVar121._0_4_ = sqrtf(fVar290);
                  auVar121._4_60_ = extraout_var;
                  auVar103 = auVar121._0_16_;
                  auVar161 = local_980._0_16_;
                  auVar219 = local_a00._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar186,auVar186);
                }
                auVar219 = vsubps_avx(auVar161,auVar219);
                auVar233._0_4_ = auVar219._0_4_ * 3.0;
                auVar233._4_4_ = auVar219._4_4_ * 3.0;
                auVar233._8_4_ = auVar219._8_4_ * 3.0;
                auVar233._12_4_ = auVar219._12_4_ * 3.0;
                auVar219 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar202._0_16_);
                auVar161 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar202._0_16_,
                                           local_9e0._0_16_);
                fVar97 = local_9e0._0_4_ * 6.0;
                fVar159 = auVar219._0_4_ * 6.0;
                fVar155 = auVar161._0_4_ * 6.0;
                fVar291 = fVar154 * 6.0;
                auVar180._0_4_ = fVar291 * (float)local_ab0._0_4_;
                auVar180._4_4_ = fVar291 * (float)local_ab0._4_4_;
                auVar180._8_4_ = fVar291 * fStack_aa8;
                auVar180._12_4_ = fVar291 * fStack_aa4;
                auVar127._4_4_ = fVar155;
                auVar127._0_4_ = fVar155;
                auVar127._8_4_ = fVar155;
                auVar127._12_4_ = fVar155;
                auVar219 = vfmadd132ps_fma(auVar127,auVar180,local_a90);
                auVar181._4_4_ = fVar159;
                auVar181._0_4_ = fVar159;
                auVar181._8_4_ = fVar159;
                auVar181._12_4_ = fVar159;
                auVar219 = vfmadd132ps_fma(auVar181,auVar219,local_aa0);
                auVar161 = vdpps_avx(auVar233,auVar233,0x7f);
                auVar128._4_4_ = fVar97;
                auVar128._0_4_ = fVar97;
                auVar128._8_4_ = fVar97;
                auVar128._12_4_ = fVar97;
                auVar2 = vfmadd132ps_fma(auVar128,auVar219,local_a80);
                auVar219 = vblendps_avx(auVar161,_DAT_01feba10,0xe);
                auVar281 = vrsqrtss_avx(auVar219,auVar219);
                fVar155 = auVar161._0_4_;
                fVar97 = auVar281._0_4_;
                auVar281 = vdpps_avx(auVar233,auVar2,0x7f);
                fVar97 = fVar97 * 1.5 + fVar155 * -0.5 * fVar97 * fVar97 * fVar97;
                auVar129._0_4_ = auVar2._0_4_ * fVar155;
                auVar129._4_4_ = auVar2._4_4_ * fVar155;
                auVar129._8_4_ = auVar2._8_4_ * fVar155;
                auVar129._12_4_ = auVar2._12_4_ * fVar155;
                fVar159 = auVar281._0_4_;
                auVar220._0_4_ = auVar233._0_4_ * fVar159;
                auVar220._4_4_ = auVar233._4_4_ * fVar159;
                auVar220._8_4_ = auVar233._8_4_ * fVar159;
                auVar220._12_4_ = auVar233._12_4_ * fVar159;
                auVar281 = vsubps_avx(auVar129,auVar220);
                auVar219 = vrcpss_avx(auVar219,auVar219);
                auVar2 = vfnmadd213ss_fma(auVar219,auVar161,ZEXT416(0x40000000));
                fVar159 = auVar219._0_4_ * auVar2._0_4_;
                auVar219 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar123 * (float)local_900._0_4_)));
                auVar262 = ZEXT1664(auVar219);
                uVar94 = CONCAT44(auVar233._4_4_,auVar233._0_4_);
                local_8e0._0_8_ = uVar94 ^ 0x8000000080000000;
                local_8e0._8_4_ = -auVar233._8_4_;
                local_8e0._12_4_ = -auVar233._12_4_;
                auVar182._0_4_ = fVar97 * auVar281._0_4_ * fVar159;
                auVar182._4_4_ = fVar97 * auVar281._4_4_ * fVar159;
                auVar182._8_4_ = fVar97 * auVar281._8_4_ * fVar159;
                auVar182._12_4_ = fVar97 * auVar281._12_4_ * fVar159;
                local_a20._0_4_ = auVar233._0_4_ * fVar97;
                local_a20._4_4_ = auVar233._4_4_ * fVar97;
                local_a20._8_4_ = auVar233._8_4_ * fVar97;
                local_a20._12_4_ = auVar233._12_4_ * fVar97;
                local_9e0._0_16_ = auVar233;
                local_a00._0_4_ = auVar219._0_4_;
                if (fVar155 < -fVar155) {
                  local_980._0_4_ = auVar103._0_4_;
                  local_920._0_16_ = auVar182;
                  fVar97 = sqrtf(fVar155);
                  auVar103 = ZEXT416((uint)local_980._0_4_);
                  auVar262 = ZEXT464((uint)local_a00._0_4_);
                  auVar182 = local_920._0_16_;
                }
                else {
                  auVar219 = vsqrtss_avx(auVar161,auVar161);
                  fVar97 = auVar219._0_4_;
                }
                auVar219 = vdpps_avx(auVar194,local_a20._0_16_,0x7f);
                auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar103,auVar262._0_16_);
                auVar161 = vdpps_avx(local_8e0._0_16_,local_a20._0_16_,0x7f);
                auVar281 = vdpps_avx(auVar194,auVar182,0x7f);
                auVar2 = vdpps_avx(local_930,local_a20._0_16_,0x7f);
                auVar98 = vfmadd213ss_fma(ZEXT416((uint)(auVar103._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_960._0_4_ / fVar97)),auVar130)
                ;
                auVar296 = ZEXT1664(auVar98);
                auVar100._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                auVar100._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                auVar100._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                auVar100._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                auVar103 = vdpps_avx(auVar194,local_8e0._0_16_,0x7f);
                auVar140 = vsubps_avx(auVar186,auVar100);
                auVar130 = vrsqrtss_avx(auVar140,auVar140);
                fVar159 = auVar140._0_4_;
                fVar97 = auVar130._0_4_;
                fVar97 = fVar97 * 1.5 + fVar159 * -0.5 * fVar97 * fVar97 * fVar97;
                auVar130 = vdpps_avx(auVar194,local_930,0x7f);
                local_980._0_16_ = ZEXT416((uint)(auVar161._0_4_ + auVar281._0_4_));
                local_a20._0_16_ = vfnmadd231ss_fma(auVar103,auVar219,local_980._0_16_);
                local_8e0._0_16_ = auVar2;
                auVar161 = vfnmadd231ss_fma(auVar130,auVar219,auVar2);
                if (fVar159 < 0.0) {
                  local_920._0_16_ = auVar219;
                  local_740._0_4_ = auVar98._0_4_;
                  local_760._0_4_ = fVar97;
                  local_780._0_16_ = auVar161;
                  fVar159 = sqrtf(fVar159);
                  auVar296 = ZEXT464((uint)local_740._0_4_);
                  auVar262 = ZEXT464((uint)local_a00._0_4_);
                  fVar97 = (float)local_760._0_4_;
                  auVar161 = local_780._0_16_;
                  auVar219 = local_920._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar140,auVar140);
                  fVar159 = auVar103._0_4_;
                }
                auVar250 = ZEXT3264(local_a40);
                auVar265 = ZEXT3264(local_9a0);
                auVar274 = ZEXT1664(local_9e0._0_16_);
                auVar103 = vpermilps_avx(local_700._0_16_,0xff);
                auVar2 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar281 = vfmsub213ss_fma(local_a20._0_16_,ZEXT416((uint)fVar97),auVar2);
                auVar183._0_8_ = local_8e0._0_8_ ^ 0x8000000080000000;
                auVar183._8_4_ = local_8e0._8_4_ ^ 0x80000000;
                auVar183._12_4_ = local_8e0._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar281._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar281._12_4_ ^ 0x80000000;
                auVar161 = ZEXT416((uint)(auVar161._0_4_ * fVar97));
                auVar281 = vfmsub231ss_fma(ZEXT416((uint)(local_8e0._0_4_ * auVar281._0_4_)),
                                           local_980._0_16_,auVar161);
                auVar161 = vinsertps_avx(auVar161,auVar183,0x10);
                uVar93 = auVar281._0_4_;
                auVar184._4_4_ = uVar93;
                auVar184._0_4_ = uVar93;
                auVar184._8_4_ = uVar93;
                auVar184._12_4_ = uVar93;
                auVar161 = vdivps_avx(auVar161,auVar184);
                auVar130 = ZEXT416((uint)(fVar159 - auVar103._0_4_));
                auVar281 = vinsertps_avx(auVar219,auVar130,0x10);
                auVar229 = ZEXT1664(auVar281);
                auVar162._0_4_ = auVar281._0_4_ * auVar161._0_4_;
                auVar162._4_4_ = auVar281._4_4_ * auVar161._4_4_;
                auVar162._8_4_ = auVar281._8_4_ * auVar161._8_4_;
                auVar162._12_4_ = auVar281._12_4_ * auVar161._12_4_;
                auVar161 = vinsertps_avx(auVar205,local_980._0_16_,0x1c);
                auVar161 = vdivps_avx(auVar161,auVar184);
                auVar185._0_4_ = auVar281._0_4_ * auVar161._0_4_;
                auVar185._4_4_ = auVar281._4_4_ * auVar161._4_4_;
                auVar185._8_4_ = auVar281._8_4_ * auVar161._8_4_;
                auVar185._12_4_ = auVar281._12_4_ * auVar161._12_4_;
                auVar161 = vhaddps_avx(auVar162,auVar162);
                auVar103 = vhaddps_avx(auVar185,auVar185);
                fVar154 = fVar154 - auVar161._0_4_;
                auVar202 = ZEXT464((uint)fVar154);
                fVar123 = fVar123 - auVar103._0_4_;
                auVar268 = ZEXT464((uint)fVar123);
                auVar219 = vandps_avx(auVar219,local_720._0_16_);
                if (auVar296._0_4_ <= auVar219._0_4_) {
LAB_01817b19:
                  bVar43 = false;
                }
                else {
                  auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar262._0_4_ + auVar296._0_4_)),
                                             _local_7c0,ZEXT416(0x36000000));
                  auVar219 = vandps_avx(auVar130,local_720._0_16_);
                  if (auVar161._0_4_ <= auVar219._0_4_) goto LAB_01817b19;
                  fVar123 = fVar123 + (float)local_8b0._0_4_;
                  auVar268 = ZEXT464((uint)fVar123);
                  bVar43 = true;
                  if ((((fVar96 <= fVar123) &&
                       (fVar97 = *(float *)(ray + k * 4 + 0x80), fVar123 <= fVar97)) &&
                      (0.0 <= fVar154)) && (fVar154 <= 1.0)) {
                    auVar186 = vrsqrtss_avx(auVar186,auVar186);
                    fVar159 = auVar186._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar90].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar290 = fVar159 * 1.5 + fVar290 * -0.5 * fVar159 * fVar159 * fVar159;
                      local_b00._0_4_ = auVar194._0_4_;
                      local_b00._4_4_ = auVar194._4_4_;
                      fStack_af8 = auVar194._8_4_;
                      fStack_af4 = auVar194._12_4_;
                      auVar131._0_4_ = fVar290 * (float)local_b00._0_4_;
                      auVar131._4_4_ = fVar290 * (float)local_b00._4_4_;
                      auVar131._8_4_ = fVar290 * fStack_af8;
                      auVar131._12_4_ = fVar290 * fStack_af4;
                      auVar161 = vfmadd213ps_fma(auVar2,auVar131,local_9e0._0_16_);
                      auVar186 = vshufps_avx(auVar131,auVar131,0xc9);
                      auVar194 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar132._0_4_ = auVar131._0_4_ * auVar194._0_4_;
                      auVar132._4_4_ = auVar131._4_4_ * auVar194._4_4_;
                      auVar132._8_4_ = auVar131._8_4_ * auVar194._8_4_;
                      auVar132._12_4_ = auVar131._12_4_ * auVar194._12_4_;
                      auVar219 = vfmsub231ps_fma(auVar132,local_9e0._0_16_,auVar186);
                      auVar186 = vshufps_avx(auVar219,auVar219,0xc9);
                      auVar194 = vshufps_avx(auVar161,auVar161,0xc9);
                      auVar219 = vshufps_avx(auVar219,auVar219,0xd2);
                      auVar101._0_4_ = auVar161._0_4_ * auVar219._0_4_;
                      auVar101._4_4_ = auVar161._4_4_ * auVar219._4_4_;
                      auVar101._8_4_ = auVar161._8_4_ * auVar219._8_4_;
                      auVar101._12_4_ = auVar161._12_4_ * auVar219._12_4_;
                      auVar186 = vfmsub231ps_fma(auVar101,auVar186,auVar194);
                      uVar93 = auVar186._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar123;
                        uVar4 = vextractps_avx(auVar186,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar186,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar93;
                        *(float *)(ray + k * 4 + 0xf0) = fVar154;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar90;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6c0 = (RTCHitN  [16])vshufps_avx(auVar186,auVar186,0x55);
                        auVar186 = vshufps_avx(auVar186,auVar186,0xaa);
                        auStack_6b0 = auVar186;
                        local_6a0 = uVar93;
                        uStack_69c = uVar93;
                        uStack_698 = uVar93;
                        uStack_694 = uVar93;
                        local_690 = fVar154;
                        fStack_68c = fVar154;
                        fStack_688 = fVar154;
                        fStack_684 = fVar154;
                        local_680 = ZEXT416(0) << 0x20;
                        local_670 = CONCAT44(uStack_6dc,local_6e0);
                        uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                        local_660._4_4_ = uStack_6cc;
                        local_660._0_4_ = local_6d0;
                        local_660._8_4_ = uStack_6c8;
                        local_660._12_4_ = uStack_6c4;
                        vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                        uStack_64c = context->user->instID[0];
                        local_650 = uStack_64c;
                        uStack_648 = uStack_64c;
                        uStack_644 = uStack_64c;
                        uStack_640 = context->user->instPrimID[0];
                        uStack_63c = uStack_640;
                        uStack_638 = uStack_640;
                        uStack_634 = uStack_640;
                        *(float *)(ray + k * 4 + 0x80) = fVar123;
                        local_ad0 = *local_9a8;
                        uStack_ac8 = local_9a8[1];
                        local_a70.valid = (int *)&local_ad0;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_6c0;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar229 = ZEXT1664(auVar281);
                          auVar274 = ZEXT1664(local_9e0._0_16_);
                          auVar296 = ZEXT1664(auVar296._0_16_);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar268 = ZEXT1664(ZEXT416((uint)fVar123));
                          auVar202 = ZEXT1664(ZEXT416((uint)fVar154));
                          auVar265 = ZEXT3264(local_9a0);
                          auVar250 = ZEXT3264(local_a40);
                        }
                        auVar68._8_8_ = uStack_ac8;
                        auVar68._0_8_ = local_ad0;
                        if (auVar68 == (undefined1  [16])0x0) {
                          auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar186 = auVar186 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar229 = ZEXT1664(auVar229._0_16_);
                            auVar274 = ZEXT1664(auVar274._0_16_);
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var6)(&local_a70);
                            auVar268 = ZEXT1664(ZEXT416((uint)fVar123));
                            auVar202 = ZEXT1664(ZEXT416((uint)fVar154));
                            auVar265 = ZEXT3264(local_9a0);
                            auVar250 = ZEXT3264(local_a40);
                          }
                          auVar69._8_8_ = uStack_ac8;
                          auVar69._0_8_ = local_ad0;
                          auVar194 = vpcmpeqd_avx(auVar69,_DAT_01feba10);
                          auVar219 = vpcmpeqd_avx(auVar186,auVar186);
                          auVar186 = auVar194 ^ auVar219;
                          if (auVar69 != (undefined1  [16])0x0) {
                            auVar194 = auVar194 ^ auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar219;
                            auVar219 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar219;
                            auVar194 = vmaskmovps_avx(auVar194,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar194;
                          }
                        }
                        auVar133._8_8_ = 0x100000001;
                        auVar133._0_8_ = 0x100000001;
                        if ((auVar133 & auVar186) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar97;
                        }
                      }
                    }
                  }
                }
                auVar106 = local_580;
                bVar95 = lVar91 != 0;
                lVar91 = lVar91 + -1;
              } while ((!bVar43) && (bVar95));
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar93;
              auVar117._0_4_ = uVar93;
              auVar117._8_4_ = uVar93;
              auVar117._12_4_ = uVar93;
              auVar117._16_4_ = uVar93;
              auVar117._20_4_ = uVar93;
              auVar117._24_4_ = uVar93;
              auVar117._28_4_ = uVar93;
              auVar169 = vcmpps_avx(_local_820,auVar117,2);
              local_580 = vandps_avx(auVar169,local_580);
              auVar106 = auVar106 & auVar169;
              auVar262 = ZEXT3264(auVar250._0_32_);
              uVar94 = local_5c0._0_8_;
              auVar280 = local_8e0._16_16_;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          local_8e0._16_16_ = auVar280;
          auVar58._4_4_ = (float)local_600._4_4_ * (float)local_840._4_4_;
          auVar58._0_4_ = (float)local_600._0_4_ * (float)local_840._0_4_;
          auVar58._8_4_ = fStack_5f8 * fStack_838;
          auVar58._12_4_ = fStack_5f4 * fStack_834;
          auVar58._16_4_ = fStack_5f0 * fStack_830;
          auVar58._20_4_ = fStack_5ec * fStack_82c;
          auVar58._24_4_ = fStack_5e8 * fStack_828;
          auVar58._28_4_ = uStack_5e4;
          auVar186 = vfmadd132ps_fma(local_5e0,auVar58,_local_800);
          auVar186 = vfmadd132ps_fma(local_880,ZEXT1632(auVar186),_local_7e0);
          auVar106 = vandps_avx(ZEXT1632(auVar186),local_860);
          auVar149._8_4_ = 0x3e99999a;
          auVar149._0_8_ = 0x3e99999a3e99999a;
          auVar149._12_4_ = 0x3e99999a;
          auVar149._16_4_ = 0x3e99999a;
          auVar149._20_4_ = 0x3e99999a;
          auVar149._24_4_ = 0x3e99999a;
          auVar149._28_4_ = 0x3e99999a;
          auVar106 = vcmpps_avx(auVar106,auVar149,1);
          auVar169 = vorps_avx(auVar106,local_620);
          auVar150._0_4_ = auVar265._0_4_ + (float)local_7a0._0_4_;
          auVar150._4_4_ = auVar265._4_4_ + (float)local_7a0._4_4_;
          auVar150._8_4_ = auVar265._8_4_ + fStack_798;
          auVar150._12_4_ = auVar265._12_4_ + fStack_794;
          auVar150._16_4_ = auVar265._16_4_ + fStack_790;
          auVar150._20_4_ = auVar265._20_4_ + fStack_78c;
          auVar150._24_4_ = auVar265._24_4_ + fStack_788;
          auVar150._28_4_ = auVar265._28_4_ + fStack_784;
          uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar171._4_4_ = uVar93;
          auVar171._0_4_ = uVar93;
          auVar171._8_4_ = uVar93;
          auVar171._12_4_ = uVar93;
          auVar171._16_4_ = uVar93;
          auVar171._20_4_ = uVar93;
          auVar171._24_4_ = uVar93;
          auVar171._28_4_ = uVar93;
          auVar106 = vcmpps_avx(auVar150,auVar171,2);
          _local_820 = vandps_avx(auVar106,local_540);
          auVar151._8_4_ = 3;
          auVar151._0_8_ = 0x300000003;
          auVar151._12_4_ = 3;
          auVar151._16_4_ = 3;
          auVar151._20_4_ = 3;
          auVar151._24_4_ = 3;
          auVar151._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar106 = vblendvps_avx(auVar172,auVar151,auVar169);
          local_880 = vpcmpgtd_avx2(auVar106,local_560);
          local_5a0 = vpandn_avx2(local_880,_local_820);
          auVar106 = _local_820 & ~local_880;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            auVar194 = vminps_avx(local_a80,local_aa0);
            auVar186 = vmaxps_avx(local_a80,local_aa0);
            auVar219 = vminps_avx(local_a90,_local_ab0);
            auVar161 = vminps_avx(auVar194,auVar219);
            auVar194 = vmaxps_avx(local_a90,_local_ab0);
            auVar219 = vmaxps_avx(auVar186,auVar194);
            local_8e0._8_4_ = NAN;
            local_8e0._0_8_ = 0x7fffffff7fffffff;
            local_8e0._12_4_ = NAN;
            auVar186 = vandps_avx(auVar161,local_8e0._0_16_);
            auVar194 = vandps_avx(auVar219,local_8e0._0_16_);
            auVar186 = vmaxps_avx(auVar186,auVar194);
            auVar194 = vmovshdup_avx(auVar186);
            auVar194 = vmaxss_avx(auVar194,auVar186);
            auVar186 = vshufpd_avx(auVar186,auVar186,1);
            auVar186 = vmaxss_avx(auVar186,auVar194);
            local_960._0_4_ = auVar186._0_4_ * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar219,auVar219,0xff);
            local_780 = _local_3e0;
            local_7c0._4_4_ = (float)local_3e0._4_4_ + (float)local_7a0._4_4_;
            local_7c0._0_4_ = (float)local_3e0._0_4_ + (float)local_7a0._0_4_;
            fStack_7b8 = fStack_3d8 + fStack_798;
            fStack_7b4 = fStack_3d4 + fStack_794;
            auStack_7b0._0_4_ = fStack_3d0 + fStack_790;
            auStack_7b0._4_4_ = fStack_3cc + fStack_78c;
            fStack_7a8 = fStack_3c8 + fStack_788;
            fStack_7a4 = fStack_3c4 + fStack_784;
            do {
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar106 = vblendvps_avx(auVar152,local_780,local_5a0);
              auVar169 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar169 = vminps_avx(auVar106,auVar169);
              auVar289 = vshufpd_avx(auVar169,auVar169,5);
              auVar169 = vminps_avx(auVar169,auVar289);
              auVar289 = vpermpd_avx2(auVar169,0x4e);
              auVar169 = vminps_avx(auVar169,auVar289);
              auVar169 = vcmpps_avx(auVar106,auVar169,0);
              auVar289 = local_5a0 & auVar169;
              auVar106 = local_5a0;
              if ((((((((auVar289 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar289 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar289 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar289 >> 0x7f,0) != '\0') ||
                    (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar289 >> 0xbf,0) != '\0') ||
                  (auVar289 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar289[0x1f] < '\0') {
                auVar106 = vandps_avx(auVar169,local_5a0);
              }
              uVar92 = vmovmskps_avx(auVar106);
              iVar12 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar12 = iVar12 + 1;
              }
              uVar87 = iVar12 << 2;
              *(undefined4 *)(local_5a0 + uVar87) = 0;
              uVar92 = *(uint *)(local_4e0 + uVar87);
              uVar87 = *(uint *)(local_3c0 + uVar87);
              fVar123 = local_ab8;
              if ((float)local_940._0_4_ < 0.0) {
                fVar123 = sqrtf((float)local_940._0_4_);
              }
              auVar250 = ZEXT464(uVar87);
              auVar202 = ZEXT464(uVar92);
              local_980._0_4_ = fVar123 * 1.9073486e-06;
              lVar91 = 4;
              do {
                fVar154 = auVar202._0_4_;
                fVar97 = 1.0 - fVar154;
                local_9e0._0_16_ = ZEXT416((uint)fVar97);
                auVar134._0_4_ = local_aa0._0_4_ * fVar154;
                auVar134._4_4_ = local_aa0._4_4_ * fVar154;
                auVar134._8_4_ = local_aa0._8_4_ * fVar154;
                auVar134._12_4_ = local_aa0._12_4_ * fVar154;
                auVar163._4_4_ = fVar97;
                auVar163._0_4_ = fVar97;
                auVar163._8_4_ = fVar97;
                auVar163._12_4_ = fVar97;
                auVar186 = vfmadd231ps_fma(auVar134,auVar163,local_a80);
                auVar187._0_4_ = local_a90._0_4_ * fVar154;
                auVar187._4_4_ = local_a90._4_4_ * fVar154;
                auVar187._8_4_ = local_a90._8_4_ * fVar154;
                auVar187._12_4_ = local_a90._12_4_ * fVar154;
                auVar194 = vfmadd231ps_fma(auVar187,auVar163,local_aa0);
                auVar221._0_4_ = fVar154 * auVar194._0_4_;
                auVar221._4_4_ = fVar154 * auVar194._4_4_;
                auVar221._8_4_ = fVar154 * auVar194._8_4_;
                auVar221._12_4_ = fVar154 * auVar194._12_4_;
                auVar219 = vfmadd231ps_fma(auVar221,auVar163,auVar186);
                auVar135._0_4_ = fVar154 * (float)local_ab0._0_4_;
                auVar135._4_4_ = fVar154 * (float)local_ab0._4_4_;
                auVar135._8_4_ = fVar154 * fStack_aa8;
                auVar135._12_4_ = fVar154 * fStack_aa4;
                auVar186 = vfmadd231ps_fma(auVar135,auVar163,local_a90);
                auVar206._0_4_ = fVar154 * auVar186._0_4_;
                auVar206._4_4_ = fVar154 * auVar186._4_4_;
                auVar206._8_4_ = fVar154 * auVar186._8_4_;
                auVar206._12_4_ = fVar154 * auVar186._12_4_;
                auVar161 = vfmadd231ps_fma(auVar206,auVar163,auVar194);
                fVar123 = auVar250._0_4_;
                auVar136._4_4_ = fVar123;
                auVar136._0_4_ = fVar123;
                auVar136._8_4_ = fVar123;
                auVar136._12_4_ = fVar123;
                auVar186 = vfmadd213ps_fma(auVar136,local_930,_DAT_01feba10);
                auVar102._0_4_ = fVar154 * auVar161._0_4_;
                auVar102._4_4_ = fVar154 * auVar161._4_4_;
                auVar102._8_4_ = fVar154 * auVar161._8_4_;
                auVar102._12_4_ = fVar154 * auVar161._12_4_;
                auVar194 = vfmadd231ps_fma(auVar102,auVar219,auVar163);
                local_700._0_16_ = auVar194;
                auVar194 = vsubps_avx(auVar186,auVar194);
                auVar186 = vdpps_avx(auVar194,auVar194,0x7f);
                fVar290 = auVar186._0_4_;
                if (fVar290 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar97);
                  local_a00._0_16_ = auVar219;
                  local_a20._0_16_ = auVar161;
                  auVar122._0_4_ = sqrtf(fVar290);
                  auVar122._4_60_ = extraout_var_00;
                  auVar103 = auVar122._0_16_;
                  auVar161 = local_a20._0_16_;
                  auVar219 = local_a00._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar186,auVar186);
                }
                auVar219 = vsubps_avx(auVar161,auVar219);
                auVar258._0_4_ = auVar219._0_4_ * 3.0;
                auVar258._4_4_ = auVar219._4_4_ * 3.0;
                auVar258._8_4_ = auVar219._8_4_ * 3.0;
                auVar258._12_4_ = auVar219._12_4_ * 3.0;
                auVar219 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0._0_16_,
                                           auVar202._0_16_);
                auVar161 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar202._0_16_,
                                           local_9e0._0_16_);
                fVar97 = local_9e0._0_4_ * 6.0;
                fVar159 = auVar219._0_4_ * 6.0;
                fVar155 = auVar161._0_4_ * 6.0;
                fVar291 = fVar154 * 6.0;
                auVar188._0_4_ = fVar291 * (float)local_ab0._0_4_;
                auVar188._4_4_ = fVar291 * (float)local_ab0._4_4_;
                auVar188._8_4_ = fVar291 * fStack_aa8;
                auVar188._12_4_ = fVar291 * fStack_aa4;
                auVar137._4_4_ = fVar155;
                auVar137._0_4_ = fVar155;
                auVar137._8_4_ = fVar155;
                auVar137._12_4_ = fVar155;
                auVar219 = vfmadd132ps_fma(auVar137,auVar188,local_a90);
                auVar189._4_4_ = fVar159;
                auVar189._0_4_ = fVar159;
                auVar189._8_4_ = fVar159;
                auVar189._12_4_ = fVar159;
                auVar219 = vfmadd132ps_fma(auVar189,auVar219,local_aa0);
                auVar161 = vdpps_avx(auVar258,auVar258,0x7f);
                auVar138._4_4_ = fVar97;
                auVar138._0_4_ = fVar97;
                auVar138._8_4_ = fVar97;
                auVar138._12_4_ = fVar97;
                auVar2 = vfmadd132ps_fma(auVar138,auVar219,local_a80);
                auVar219 = vblendps_avx(auVar161,_DAT_01feba10,0xe);
                auVar281 = vrsqrtss_avx(auVar219,auVar219);
                fVar155 = auVar161._0_4_;
                fVar97 = auVar281._0_4_;
                auVar281 = vdpps_avx(auVar258,auVar2,0x7f);
                fVar97 = fVar97 * 1.5 + fVar155 * -0.5 * fVar97 * fVar97 * fVar97;
                auVar139._0_4_ = auVar2._0_4_ * fVar155;
                auVar139._4_4_ = auVar2._4_4_ * fVar155;
                auVar139._8_4_ = auVar2._8_4_ * fVar155;
                auVar139._12_4_ = auVar2._12_4_ * fVar155;
                fVar159 = auVar281._0_4_;
                auVar222._0_4_ = auVar258._0_4_ * fVar159;
                auVar222._4_4_ = auVar258._4_4_ * fVar159;
                auVar222._8_4_ = auVar258._8_4_ * fVar159;
                auVar222._12_4_ = auVar258._12_4_ * fVar159;
                auVar281 = vsubps_avx(auVar139,auVar222);
                auVar219 = vrcpss_avx(auVar219,auVar219);
                auVar2 = vfnmadd213ss_fma(auVar219,auVar161,ZEXT416(0x40000000));
                fVar159 = auVar219._0_4_ * auVar2._0_4_;
                auVar219 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar123 * (float)local_980._0_4_)));
                auVar268 = ZEXT1664(auVar219);
                uVar94 = CONCAT44(auVar258._4_4_,auVar258._0_4_);
                auVar234._0_8_ = uVar94 ^ 0x8000000080000000;
                auVar234._8_4_ = -auVar258._8_4_;
                auVar234._12_4_ = -auVar258._12_4_;
                auVar190._0_4_ = fVar97 * auVar281._0_4_ * fVar159;
                auVar190._4_4_ = fVar97 * auVar281._4_4_ * fVar159;
                auVar190._8_4_ = fVar97 * auVar281._8_4_ * fVar159;
                auVar190._12_4_ = fVar97 * auVar281._12_4_ * fVar159;
                auVar241._0_4_ = auVar258._0_4_ * fVar97;
                auVar241._4_4_ = auVar258._4_4_ * fVar97;
                auVar241._8_4_ = auVar258._8_4_ * fVar97;
                auVar241._12_4_ = auVar258._12_4_ * fVar97;
                local_9e0._0_16_ = auVar258;
                local_a00._0_4_ = auVar219._0_4_;
                if (fVar155 < -fVar155) {
                  local_a20._0_4_ = auVar103._0_4_;
                  local_900._0_16_ = auVar234;
                  local_a40._0_16_ = auVar241;
                  local_9a0._0_16_ = auVar190;
                  fVar97 = sqrtf(fVar155);
                  auVar103 = ZEXT416((uint)local_a20._0_4_);
                  auVar268 = ZEXT464((uint)local_a00._0_4_);
                  auVar190 = local_9a0._0_16_;
                  auVar234 = local_900._0_16_;
                  auVar241 = local_a40._0_16_;
                }
                else {
                  auVar219 = vsqrtss_avx(auVar161,auVar161);
                  fVar97 = auVar219._0_4_;
                }
                auVar219 = vdpps_avx(auVar194,auVar241,0x7f);
                auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar103,auVar268._0_16_);
                auVar161 = vdpps_avx(auVar234,auVar241,0x7f);
                auVar281 = vdpps_avx(auVar194,auVar190,0x7f);
                auVar2 = vdpps_avx(local_930,auVar241,0x7f);
                auVar130 = vfmadd213ss_fma(ZEXT416((uint)(auVar103._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar97)),auVar130
                                          );
                auVar274 = ZEXT1664(auVar130);
                fVar97 = auVar161._0_4_ + auVar281._0_4_;
                auVar104._0_4_ = auVar219._0_4_ * auVar219._0_4_;
                auVar104._4_4_ = auVar219._4_4_ * auVar219._4_4_;
                auVar104._8_4_ = auVar219._8_4_ * auVar219._8_4_;
                auVar104._12_4_ = auVar219._12_4_ * auVar219._12_4_;
                auVar161 = vdpps_avx(auVar194,auVar234,0x7f);
                auVar281 = vsubps_avx(auVar186,auVar104);
                auVar103 = vrsqrtss_avx(auVar281,auVar281);
                fVar155 = auVar281._0_4_;
                fVar159 = auVar103._0_4_;
                fVar159 = fVar159 * 1.5 + fVar155 * -0.5 * fVar159 * fVar159 * fVar159;
                auVar103 = vdpps_avx(auVar194,local_930,0x7f);
                auVar161 = vfnmadd231ss_fma(auVar161,auVar219,ZEXT416((uint)fVar97));
                auVar103 = vfnmadd231ss_fma(auVar103,auVar219,auVar2);
                if (fVar155 < 0.0) {
                  local_a20._0_16_ = auVar219;
                  local_900._0_4_ = auVar130._0_4_;
                  local_a40._0_16_ = ZEXT416((uint)fVar97);
                  local_9a0._0_16_ = auVar2;
                  local_720._0_16_ = auVar161;
                  local_920._0_4_ = fVar159;
                  local_740._0_16_ = auVar103;
                  fVar155 = sqrtf(fVar155);
                  auVar274 = ZEXT464((uint)local_900._0_4_);
                  auVar268 = ZEXT464((uint)local_a00._0_4_);
                  fVar159 = (float)local_920._0_4_;
                  auVar103 = local_740._0_16_;
                  auVar219 = local_a20._0_16_;
                  auVar2 = local_9a0._0_16_;
                  auVar161 = local_720._0_16_;
                  auVar281 = local_a40._0_16_;
                }
                else {
                  auVar281 = vsqrtss_avx(auVar281,auVar281);
                  fVar155 = auVar281._0_4_;
                  auVar281 = ZEXT416((uint)fVar97);
                }
                auVar265 = ZEXT1664(auVar186);
                auVar262 = ZEXT1664(local_9e0._0_16_);
                auVar140 = vpermilps_avx(local_700._0_16_,0xff);
                auVar130 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
                auVar98 = vfmsub213ss_fma(auVar161,ZEXT416((uint)fVar159),auVar130);
                auVar296 = ZEXT1664(auVar98);
                auVar191._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar2._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar2._12_4_ ^ 0x80000000;
                auVar207._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar98._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar98._12_4_ ^ 0x80000000;
                auVar161 = ZEXT416((uint)(auVar103._0_4_ * fVar159));
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar98._0_4_)),auVar281,
                                           auVar161);
                auVar161 = vinsertps_avx(auVar161,auVar191,0x10);
                uVar93 = auVar103._0_4_;
                auVar192._4_4_ = uVar93;
                auVar192._0_4_ = uVar93;
                auVar192._8_4_ = uVar93;
                auVar192._12_4_ = uVar93;
                auVar161 = vdivps_avx(auVar161,auVar192);
                auVar140 = ZEXT416((uint)(fVar155 - auVar140._0_4_));
                auVar2 = vinsertps_avx(auVar219,auVar140,0x10);
                auVar229 = ZEXT1664(auVar2);
                auVar164._0_4_ = auVar2._0_4_ * auVar161._0_4_;
                auVar164._4_4_ = auVar2._4_4_ * auVar161._4_4_;
                auVar164._8_4_ = auVar2._8_4_ * auVar161._8_4_;
                auVar164._12_4_ = auVar2._12_4_ * auVar161._12_4_;
                auVar161 = vinsertps_avx(auVar207,auVar281,0x1c);
                auVar161 = vdivps_avx(auVar161,auVar192);
                auVar193._0_4_ = auVar2._0_4_ * auVar161._0_4_;
                auVar193._4_4_ = auVar2._4_4_ * auVar161._4_4_;
                auVar193._8_4_ = auVar2._8_4_ * auVar161._8_4_;
                auVar193._12_4_ = auVar2._12_4_ * auVar161._12_4_;
                auVar161 = vhaddps_avx(auVar164,auVar164);
                auVar103 = vhaddps_avx(auVar193,auVar193);
                fVar154 = fVar154 - auVar161._0_4_;
                auVar202 = ZEXT464((uint)fVar154);
                fVar123 = fVar123 - auVar103._0_4_;
                auVar250 = ZEXT464((uint)fVar123);
                auVar219 = vandps_avx(auVar219,local_8e0._0_16_);
                if (auVar274._0_4_ <= auVar219._0_4_) {
LAB_01818686:
                  bVar43 = false;
                }
                else {
                  auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ + auVar274._0_4_)),
                                             local_760._0_16_,ZEXT416(0x36000000));
                  auVar219 = vandps_avx(auVar140,local_8e0._0_16_);
                  if (auVar161._0_4_ <= auVar219._0_4_) goto LAB_01818686;
                  fVar123 = fVar123 + (float)local_8b0._0_4_;
                  auVar250 = ZEXT464((uint)fVar123);
                  bVar43 = true;
                  if ((((fVar96 <= fVar123) &&
                       (fVar97 = *(float *)(ray + k * 4 + 0x80), fVar123 <= fVar97)) &&
                      (0.0 <= fVar154)) && (fVar154 <= 1.0)) {
                    auVar219 = vrsqrtss_avx(auVar186,auVar186);
                    fVar159 = auVar219._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar90].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar290 = fVar159 * 1.5 + fVar290 * -0.5 * fVar159 * fVar159 * fVar159;
                      local_b00._0_4_ = auVar194._0_4_;
                      local_b00._4_4_ = auVar194._4_4_;
                      fStack_af8 = auVar194._8_4_;
                      fStack_af4 = auVar194._12_4_;
                      auVar141._0_4_ = fVar290 * (float)local_b00._0_4_;
                      auVar141._4_4_ = fVar290 * (float)local_b00._4_4_;
                      auVar141._8_4_ = fVar290 * fStack_af8;
                      auVar141._12_4_ = fVar290 * fStack_af4;
                      auVar103 = vfmadd213ps_fma(auVar130,auVar141,local_9e0._0_16_);
                      auVar194 = vshufps_avx(auVar141,auVar141,0xc9);
                      auVar219 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                      auVar142._0_4_ = auVar141._0_4_ * auVar219._0_4_;
                      auVar142._4_4_ = auVar141._4_4_ * auVar219._4_4_;
                      auVar142._8_4_ = auVar141._8_4_ * auVar219._8_4_;
                      auVar142._12_4_ = auVar141._12_4_ * auVar219._12_4_;
                      auVar161 = vfmsub231ps_fma(auVar142,local_9e0._0_16_,auVar194);
                      auVar194 = vshufps_avx(auVar161,auVar161,0xc9);
                      auVar219 = vshufps_avx(auVar103,auVar103,0xc9);
                      auVar161 = vshufps_avx(auVar161,auVar161,0xd2);
                      auVar105._0_4_ = auVar103._0_4_ * auVar161._0_4_;
                      auVar105._4_4_ = auVar103._4_4_ * auVar161._4_4_;
                      auVar105._8_4_ = auVar103._8_4_ * auVar161._8_4_;
                      auVar105._12_4_ = auVar103._12_4_ * auVar161._12_4_;
                      auVar194 = vfmsub231ps_fma(auVar105,auVar194,auVar219);
                      uVar93 = auVar194._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar123;
                        uVar4 = vextractps_avx(auVar194,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                        uVar4 = vextractps_avx(auVar194,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar93;
                        *(float *)(ray + k * 4 + 0xf0) = fVar154;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar1;
                        *(uint *)(ray + k * 4 + 0x120) = uVar90;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6c0 = (RTCHitN  [16])vshufps_avx(auVar194,auVar194,0x55);
                        auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
                        auStack_6b0 = auVar194;
                        local_6a0 = uVar93;
                        uStack_69c = uVar93;
                        uStack_698 = uVar93;
                        uStack_694 = uVar93;
                        local_690 = fVar154;
                        fStack_68c = fVar154;
                        fStack_688 = fVar154;
                        fStack_684 = fVar154;
                        local_680 = ZEXT416(0) << 0x20;
                        local_670 = CONCAT44(uStack_6dc,local_6e0);
                        uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                        local_660._4_4_ = uStack_6cc;
                        local_660._0_4_ = local_6d0;
                        local_660._8_4_ = uStack_6c8;
                        local_660._12_4_ = uStack_6c4;
                        vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                        uStack_64c = context->user->instID[0];
                        local_650 = uStack_64c;
                        uStack_648 = uStack_64c;
                        uStack_644 = uStack_64c;
                        uStack_640 = context->user->instPrimID[0];
                        uStack_63c = uStack_640;
                        uStack_638 = uStack_640;
                        uStack_634 = uStack_640;
                        *(float *)(ray + k * 4 + 0x80) = fVar123;
                        local_ad0 = *local_9a8;
                        uStack_ac8 = local_9a8[1];
                        local_a70.valid = (int *)&local_ad0;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_6c0;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar229 = ZEXT1664(auVar2);
                          auVar262 = ZEXT1664(local_9e0._0_16_);
                          auVar265 = ZEXT1664(auVar186);
                          auVar268 = ZEXT1664(auVar268._0_16_);
                          auVar274 = ZEXT1664(auVar274._0_16_);
                          auVar296 = ZEXT1664(auVar98);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar250 = ZEXT1664(ZEXT416((uint)fVar123));
                          auVar202 = ZEXT1664(ZEXT416((uint)fVar154));
                        }
                        auVar70._8_8_ = uStack_ac8;
                        auVar70._0_8_ = local_ad0;
                        if (auVar70 == (undefined1  [16])0x0) {
                          auVar186 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar186 = auVar186 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar229 = ZEXT1664(auVar229._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar265 = ZEXT1664(auVar265._0_16_);
                            auVar268 = ZEXT1664(auVar268._0_16_);
                            auVar274 = ZEXT1664(auVar274._0_16_);
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            (*p_Var6)(&local_a70);
                            auVar250 = ZEXT1664(ZEXT416((uint)fVar123));
                            auVar202 = ZEXT1664(ZEXT416((uint)fVar154));
                          }
                          auVar71._8_8_ = uStack_ac8;
                          auVar71._0_8_ = local_ad0;
                          auVar219 = vpcmpeqd_avx(auVar71,_DAT_01feba10);
                          auVar194 = vpcmpeqd_avx(auVar194,auVar194);
                          auVar186 = auVar219 ^ auVar194;
                          if (auVar71 != (undefined1  [16])0x0) {
                            auVar219 = auVar219 ^ auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar194;
                            auVar194 = vmaskmovps_avx(auVar219,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar194;
                          }
                        }
                        auVar143._8_8_ = 0x100000001;
                        auVar143._0_8_ = 0x100000001;
                        if ((auVar143 & auVar186) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar97;
                        }
                      }
                    }
                  }
                }
                auVar106 = local_5a0;
                bVar95 = lVar91 != 0;
                lVar91 = lVar91 + -1;
              } while ((!bVar43) && (bVar95));
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar118._4_4_ = uVar93;
              auVar118._0_4_ = uVar93;
              auVar118._8_4_ = uVar93;
              auVar118._12_4_ = uVar93;
              auVar118._16_4_ = uVar93;
              auVar118._20_4_ = uVar93;
              auVar118._24_4_ = uVar93;
              auVar118._28_4_ = uVar93;
              auVar169 = vcmpps_avx(_local_7c0,auVar118,2);
              local_5a0 = vandps_avx(auVar169,local_5a0);
              auVar106 = auVar106 & auVar169;
              uVar94 = local_5c0._0_8_;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          auVar153._0_4_ = (float)local_7a0._0_4_ + local_420._0_4_;
          auVar153._4_4_ = (float)local_7a0._4_4_ + local_420._4_4_;
          auVar153._8_4_ = fStack_798 + local_420._8_4_;
          auVar153._12_4_ = fStack_794 + local_420._12_4_;
          auVar153._16_4_ = fStack_790 + local_420._16_4_;
          auVar153._20_4_ = fStack_78c + local_420._20_4_;
          auVar153._24_4_ = fStack_788 + local_420._24_4_;
          auVar153._28_4_ = fStack_784 + local_420._28_4_;
          uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar201._4_4_ = uVar93;
          auVar201._0_4_ = uVar93;
          auVar201._8_4_ = uVar93;
          auVar201._12_4_ = uVar93;
          auVar201._16_4_ = uVar93;
          auVar201._20_4_ = uVar93;
          auVar201._24_4_ = uVar93;
          auVar201._28_4_ = uVar93;
          auVar169 = vcmpps_avx(auVar153,auVar201,2);
          auVar106 = vandps_avx(local_520,local_500);
          auVar106 = vandps_avx(auVar169,auVar106);
          auVar210._0_4_ = (float)local_7a0._0_4_ + local_3e0._0_4_;
          auVar210._4_4_ = (float)local_7a0._4_4_ + local_3e0._4_4_;
          auVar210._8_4_ = fStack_798 + local_3e0._8_4_;
          auVar210._12_4_ = fStack_794 + local_3e0._12_4_;
          auVar210._16_4_ = fStack_790 + local_3e0._16_4_;
          auVar210._20_4_ = fStack_78c + local_3e0._20_4_;
          auVar210._24_4_ = fStack_788 + local_3e0._24_4_;
          auVar210._28_4_ = fStack_784 + local_3e0._28_4_;
          auVar289 = vcmpps_avx(auVar210,auVar201,2);
          auVar169 = vandps_avx(local_880,_local_820);
          auVar169 = vandps_avx(auVar289,auVar169);
          auVar169 = vorps_avx(auVar106,auVar169);
          if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0x7f,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar169 >> 0xbf,0) != '\0') ||
              (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar169[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar88 * 0x60) = auVar169;
            auVar106 = vblendvps_avx(_local_3e0,local_420,auVar106);
            *(undefined1 (*) [32])(auStack_160 + uVar88 * 0x60) = auVar106;
            auVar73._8_8_ = uStack_8b8;
            auVar73._0_8_ = local_8c0;
            uVar239 = vmovlps_avx(auVar73);
            *(undefined8 *)(afStack_140 + uVar88 * 0x18) = uVar239;
            auStack_138[uVar88 * 0x18] = (int)uVar94 + 1;
            uVar88 = (ulong)((int)uVar88 + 1);
          }
        }
        goto LAB_01816c4f;
      }
    }
    do {
      if ((int)uVar88 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar120._4_4_ = uVar1;
        auVar120._0_4_ = uVar1;
        auVar120._8_4_ = uVar1;
        auVar120._12_4_ = uVar1;
        auVar120._16_4_ = uVar1;
        auVar120._20_4_ = uVar1;
        auVar120._24_4_ = uVar1;
        auVar120._28_4_ = uVar1;
        auVar106 = vcmpps_avx(local_3a0,auVar120,2);
        uVar90 = vmovmskps_avx(auVar106);
        uVar90 = (uint)local_888 & uVar90;
        if (uVar90 == 0) {
          return;
        }
        goto LAB_0181635b;
      }
      uVar89 = (ulong)((int)uVar88 - 1);
      lVar91 = uVar89 * 0x60;
      auVar106 = *(undefined1 (*) [32])(auStack_160 + lVar91);
      auVar115._0_4_ = auVar106._0_4_ + (float)local_7a0._0_4_;
      auVar115._4_4_ = auVar106._4_4_ + (float)local_7a0._4_4_;
      auVar115._8_4_ = auVar106._8_4_ + fStack_798;
      auVar115._12_4_ = auVar106._12_4_ + fStack_794;
      auVar115._16_4_ = auVar106._16_4_ + fStack_790;
      auVar115._20_4_ = auVar106._20_4_ + fStack_78c;
      auVar115._24_4_ = auVar106._24_4_ + fStack_788;
      auVar115._28_4_ = auVar106._28_4_ + fStack_784;
      uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar198._4_4_ = uVar93;
      auVar198._0_4_ = uVar93;
      auVar198._8_4_ = uVar93;
      auVar198._12_4_ = uVar93;
      auVar198._16_4_ = uVar93;
      auVar198._20_4_ = uVar93;
      auVar198._24_4_ = uVar93;
      auVar198._28_4_ = uVar93;
      auVar7 = vcmpps_avx(auVar115,auVar198,2);
      auVar289 = vandps_avx(auVar7,*(undefined1 (*) [32])(auStack_180 + lVar91));
      _local_6c0 = auVar289;
      auVar8 = *(undefined1 (*) [32])(auStack_180 + lVar91) & auVar7;
      bVar64 = (auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = SUB321(auVar8 >> 0x7f,0) == '\0';
      bVar61 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar60 = SUB321(auVar8 >> 0xbf,0) == '\0';
      bVar95 = (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar43 = -1 < auVar8[0x1f];
      if (((((((!bVar64 || !bVar65) || !bVar63) || !bVar62) || !bVar61) || !bVar60) || !bVar95) ||
          !bVar43) {
        auVar166._8_4_ = 0x7f800000;
        auVar166._0_8_ = 0x7f8000007f800000;
        auVar166._12_4_ = 0x7f800000;
        auVar166._16_4_ = 0x7f800000;
        auVar166._20_4_ = 0x7f800000;
        auVar166._24_4_ = 0x7f800000;
        auVar166._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar166,auVar106,auVar289);
        auVar7 = vshufps_avx(auVar106,auVar106,0xb1);
        auVar7 = vminps_avx(auVar106,auVar7);
        auVar8 = vshufpd_avx(auVar7,auVar7,5);
        auVar8 = vminps_avx(auVar7,auVar8);
        auVar7 = vpermpd_avx2(auVar8,0x4e);
        auVar8 = vminps_avx(auVar8,auVar7);
        auVar106 = vcmpps_avx(auVar106,auVar8,0);
        auVar8 = auVar289 & auVar106;
        if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0x7f,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0xbf,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar8[0x1f] < '\0') {
          auVar289 = vandps_avx(auVar106,auVar289);
        }
        fVar123 = afStack_140[uVar89 * 0x18 + 1];
        uVar94 = (ulong)auStack_138[uVar89 * 0x18];
        uVar92 = vmovmskps_avx(auVar289);
        iVar12 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          iVar12 = iVar12 + 1;
        }
        fVar97 = afStack_140[uVar89 * 0x18];
        auVar116._4_4_ = fVar97;
        auVar116._0_4_ = fVar97;
        auVar116._8_4_ = fVar97;
        auVar116._12_4_ = fVar97;
        auVar116._16_4_ = fVar97;
        auVar116._20_4_ = fVar97;
        auVar116._24_4_ = fVar97;
        auVar116._28_4_ = fVar97;
        *(undefined4 *)(local_6c0 + (uint)(iVar12 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar91) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar89 = uVar88;
        }
        fVar123 = fVar123 - fVar97;
        auVar145._4_4_ = fVar123;
        auVar145._0_4_ = fVar123;
        auVar145._8_4_ = fVar123;
        auVar145._12_4_ = fVar123;
        auVar145._16_4_ = fVar123;
        auVar145._20_4_ = fVar123;
        auVar145._24_4_ = fVar123;
        auVar145._28_4_ = fVar123;
        auVar186 = vfmadd132ps_fma(auVar145,auVar116,_DAT_02020f20);
        local_420 = ZEXT1632(auVar186);
        local_8c0 = *(undefined8 *)(local_420 + (uint)(iVar12 << 2));
        uStack_8b8 = 0;
      }
      uVar88 = uVar89;
      auVar202 = ZEXT3264(auVar7);
    } while (((((((bVar64 && bVar65) && bVar63) && bVar62) && bVar61) && bVar60) && bVar95) &&
             bVar43);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }